

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx2::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  byte bVar82;
  int iVar83;
  undefined1 (*pauVar84) [32];
  uint uVar85;
  uint uVar86;
  uint uVar87;
  ulong uVar88;
  ulong uVar89;
  bool bVar90;
  ulong uVar91;
  bool bVar92;
  float fVar93;
  float fVar129;
  float fVar131;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar110 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined4 uVar94;
  float fVar95;
  undefined1 auVar113 [32];
  float fVar130;
  float fVar132;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar109 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar153;
  float fVar177;
  float fVar178;
  undefined1 auVar154 [16];
  float fVar179;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  undefined1 auVar176 [64];
  vint4 ai_2;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar215;
  float fVar218;
  vint4 ai;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar221;
  undefined1 auVar211 [32];
  float fVar216;
  float fVar219;
  float fVar222;
  undefined1 auVar212 [32];
  float fVar217;
  float fVar220;
  float fVar223;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  vint4 bi;
  undefined1 auVar241 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar242 [32];
  undefined1 auVar239 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar243 [32];
  undefined1 auVar240 [16];
  undefined1 auVar244 [64];
  vint4 ai_1;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar256;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  float fVar257;
  float fVar261;
  float fVar262;
  undefined1 auVar258 [16];
  float fVar263;
  undefined1 auVar259 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [64];
  undefined1 auVar267 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  float fVar272;
  undefined1 auVar271 [64];
  float fVar273;
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ccc;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  RTCFilterFunctionNArguments local_b50;
  undefined1 local_b20 [8];
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_970 [16];
  Primitive *local_958;
  Primitive *local_950;
  ulong local_948;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  uint local_800;
  uint uStack_7fc;
  uint uStack_7f8;
  uint uStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  uint uStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  undefined4 uStack_67c;
  undefined4 uStack_678;
  undefined4 uStack_674;
  undefined4 uStack_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined4 local_460;
  undefined4 uStack_45c;
  undefined4 uStack_458;
  undefined4 uStack_454;
  undefined4 uStack_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  uint local_3a0;
  uint uStack_39c;
  uint uStack_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  uint uStack_388;
  uint uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined4 uStack_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar268 [16];
  undefined1 auVar277 [64];
  undefined1 auVar282 [64];
  
  PVar2 = prim[1];
  uVar91 = (ulong)(byte)PVar2;
  lVar22 = uVar91 * 0x19;
  fVar93 = *(float *)(prim + lVar22 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + lVar22 + 6));
  auVar96._0_4_ = fVar93 * auVar5._0_4_;
  auVar96._4_4_ = fVar93 * auVar5._4_4_;
  auVar96._8_4_ = fVar93 * auVar5._8_4_;
  auVar96._12_4_ = fVar93 * auVar5._12_4_;
  auVar224._0_4_ = fVar93 * auVar6._0_4_;
  auVar224._4_4_ = fVar93 * auVar6._4_4_;
  auVar224._8_4_ = fVar93 * auVar6._8_4_;
  auVar224._12_4_ = fVar93 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar91 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar89 = (ulong)(uint)((int)(uVar91 * 9) * 2);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar91 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar89 = (ulong)(uint)((int)(uVar91 * 5) << 2);
  auVar154 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar292._4_4_ = auVar224._0_4_;
  auVar292._0_4_ = auVar224._0_4_;
  auVar292._8_4_ = auVar224._0_4_;
  auVar292._12_4_ = auVar224._0_4_;
  auVar105 = vshufps_avx(auVar224,auVar224,0x55);
  auVar100 = vshufps_avx(auVar224,auVar224,0xaa);
  fVar93 = auVar100._0_4_;
  auVar274._0_4_ = fVar93 * auVar7._0_4_;
  fVar129 = auVar100._4_4_;
  auVar274._4_4_ = fVar129 * auVar7._4_4_;
  fVar201 = auVar100._8_4_;
  auVar274._8_4_ = fVar201 * auVar7._8_4_;
  fVar215 = auVar100._12_4_;
  auVar274._12_4_ = fVar215 * auVar7._12_4_;
  auVar267._0_4_ = auVar10._0_4_ * fVar93;
  auVar267._4_4_ = auVar10._4_4_ * fVar129;
  auVar267._8_4_ = auVar10._8_4_ * fVar201;
  auVar267._12_4_ = auVar10._12_4_ * fVar215;
  auVar245._0_4_ = auVar154._0_4_ * fVar93;
  auVar245._4_4_ = auVar154._4_4_ * fVar129;
  auVar245._8_4_ = auVar154._8_4_ * fVar201;
  auVar245._12_4_ = auVar154._12_4_ * fVar215;
  auVar100 = vfmadd231ps_fma(auVar274,auVar105,auVar6);
  auVar137 = vfmadd231ps_fma(auVar267,auVar105,auVar9);
  auVar105 = vfmadd231ps_fma(auVar245,auVar97,auVar105);
  auVar164 = vfmadd231ps_fma(auVar100,auVar292,auVar5);
  auVar137 = vfmadd231ps_fma(auVar137,auVar292,auVar8);
  auVar202 = vfmadd231ps_fma(auVar105,auVar98,auVar292);
  auVar293._4_4_ = auVar96._0_4_;
  auVar293._0_4_ = auVar96._0_4_;
  auVar293._8_4_ = auVar96._0_4_;
  auVar293._12_4_ = auVar96._0_4_;
  auVar105 = vshufps_avx(auVar96,auVar96,0x55);
  auVar100 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar93 = auVar100._0_4_;
  auVar225._0_4_ = fVar93 * auVar7._0_4_;
  fVar129 = auVar100._4_4_;
  auVar225._4_4_ = fVar129 * auVar7._4_4_;
  fVar201 = auVar100._8_4_;
  auVar225._8_4_ = fVar201 * auVar7._8_4_;
  fVar215 = auVar100._12_4_;
  auVar225._12_4_ = fVar215 * auVar7._12_4_;
  auVar136._0_4_ = auVar10._0_4_ * fVar93;
  auVar136._4_4_ = auVar10._4_4_ * fVar129;
  auVar136._8_4_ = auVar10._8_4_ * fVar201;
  auVar136._12_4_ = auVar10._12_4_ * fVar215;
  auVar100._0_4_ = auVar154._0_4_ * fVar93;
  auVar100._4_4_ = auVar154._4_4_ * fVar129;
  auVar100._8_4_ = auVar154._8_4_ * fVar201;
  auVar100._12_4_ = auVar154._12_4_ * fVar215;
  auVar6 = vfmadd231ps_fma(auVar225,auVar105,auVar6);
  auVar7 = vfmadd231ps_fma(auVar136,auVar105,auVar9);
  auVar9 = vfmadd231ps_fma(auVar100,auVar105,auVar97);
  auVar10 = vfmadd231ps_fma(auVar6,auVar293,auVar5);
  auVar97 = vfmadd231ps_fma(auVar7,auVar293,auVar8);
  auVar154 = vfmadd231ps_fma(auVar9,auVar293,auVar98);
  auVar237._8_4_ = 0x7fffffff;
  auVar237._0_8_ = 0x7fffffff7fffffff;
  auVar237._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar164,auVar237);
  auVar158._8_4_ = 0x219392ef;
  auVar158._0_8_ = 0x219392ef219392ef;
  auVar158._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar158,1);
  auVar6 = vblendvps_avx(auVar164,auVar158,auVar5);
  auVar5 = vandps_avx(auVar137,auVar237);
  auVar5 = vcmpps_avx(auVar5,auVar158,1);
  auVar7 = vblendvps_avx(auVar137,auVar158,auVar5);
  auVar5 = vandps_avx(auVar202,auVar237);
  auVar5 = vcmpps_avx(auVar5,auVar158,1);
  auVar5 = vblendvps_avx(auVar202,auVar158,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar238._8_4_ = 0x3f800000;
  auVar238._0_8_ = 0x3f8000003f800000;
  auVar238._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar238);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar238);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar238);
  auVar98 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar91 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar202._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar202._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar202._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar202._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar91 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar226._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar226._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar226._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar226._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar137._1_3_ = 0;
  auVar137[0] = PVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar91 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar97);
  auVar246._0_4_ = auVar5._0_4_ * auVar9._0_4_;
  auVar246._4_4_ = auVar5._4_4_ * auVar9._4_4_;
  auVar246._8_4_ = auVar5._8_4_ * auVar9._8_4_;
  auVar246._12_4_ = auVar5._12_4_ * auVar9._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar97);
  auVar105._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar105._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar105._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar105._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar89 + uVar91 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar154);
  auVar164._0_4_ = auVar98._0_4_ * auVar5._0_4_;
  auVar164._4_4_ = auVar98._4_4_ * auVar5._4_4_;
  auVar164._8_4_ = auVar98._8_4_ * auVar5._8_4_;
  auVar164._12_4_ = auVar98._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar91 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar154);
  auVar97._0_4_ = auVar98._0_4_ * auVar5._0_4_;
  auVar97._4_4_ = auVar98._4_4_ * auVar5._4_4_;
  auVar97._8_4_ = auVar98._8_4_ * auVar5._8_4_;
  auVar97._12_4_ = auVar98._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar202,auVar226);
  auVar6 = vpminsd_avx(auVar246,auVar105);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar164,auVar97);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar258._4_4_ = uVar94;
  auVar258._0_4_ = uVar94;
  auVar258._8_4_ = uVar94;
  auVar258._12_4_ = uVar94;
  auVar6 = vmaxps_avx(auVar6,auVar258);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_6c0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_6c0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_6c0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_6c0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar202,auVar226);
  auVar6 = vpmaxsd_avx(auVar246,auVar105);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar164,auVar97);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar154._4_4_ = uVar94;
  auVar154._0_4_ = uVar94;
  auVar154._8_4_ = uVar94;
  auVar154._12_4_ = uVar94;
  auVar6 = vminps_avx(auVar6,auVar154);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar98._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar98._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar98._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar98._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar137[4] = PVar2;
  auVar137._5_3_ = 0;
  auVar137[8] = PVar2;
  auVar137._9_3_ = 0;
  auVar137[0xc] = PVar2;
  auVar137._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar137,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_6c0,auVar98,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar87 = vmovmskps_avx(auVar5);
  if (uVar87 == 0) {
    return false;
  }
  uVar87 = uVar87 & 0xff;
  local_958 = prim + lVar22 + 0x16;
  auVar111._16_16_ = mm_lookupmask_ps._240_16_;
  auVar111._0_16_ = mm_lookupmask_ps._240_16_;
  local_7e0 = vblendps_avx(auVar111,ZEXT832(0) << 0x20,0x80);
  iVar83 = 1 << ((uint)k & 0x1f);
  auVar112._4_4_ = iVar83;
  auVar112._0_4_ = iVar83;
  auVar112._8_4_ = iVar83;
  auVar112._12_4_ = iVar83;
  auVar112._16_4_ = iVar83;
  auVar112._20_4_ = iVar83;
  auVar112._24_4_ = iVar83;
  auVar112._28_4_ = iVar83;
  auVar173 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar111 = vpand_avx2(auVar112,auVar173);
  local_6a0 = vpcmpeqd_avx2(auVar111,auVar173);
  local_900 = 0x7fffffff;
  uStack_8fc = 0x7fffffff;
  uStack_8f8 = 0x7fffffff;
  uStack_8f4 = 0x7fffffff;
  uStack_8f0 = 0x7fffffff;
  uStack_8ec = 0x7fffffff;
  uStack_8e8 = 0x7fffffff;
  uStack_8e4 = 0x7fffffff;
  local_800 = 0x80000000;
  uStack_7fc = 0x80000000;
  uStack_7f8 = 0x80000000;
  uStack_7f4 = 0x80000000;
  fStack_7f0 = -0.0;
  fStack_7ec = -0.0;
  fStack_7e8 = -0.0;
  uStack_7e4 = 0x80000000;
  local_950 = prim;
LAB_015bcc3f:
  lVar22 = 0;
  local_948 = (ulong)uVar87;
  for (uVar91 = local_948; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  local_948 = local_948 - 1 & local_948;
  local_680 = *(undefined4 *)(local_950 + lVar22 * 4 + 6);
  uVar91 = (ulong)(uint)((int)lVar22 << 6);
  auVar5 = *(undefined1 (*) [16])(local_958 + uVar91);
  if (local_948 != 0) {
    uVar88 = local_948 - 1 & local_948;
    for (uVar89 = local_948; (uVar89 & 1) == 0; uVar89 = uVar89 >> 1 | 0x8000000000000000) {
    }
    if (uVar88 != 0) {
      for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_958 + uVar91 + 0x10);
  auVar7 = *(undefined1 (*) [16])(local_958 + uVar91 + 0x20);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar10 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar268._4_4_ = uVar94;
  auVar268._0_4_ = uVar94;
  auVar268._8_4_ = uVar94;
  auVar268._12_4_ = uVar94;
  fStack_890 = (float)uVar94;
  _local_8a0 = auVar268;
  fStack_88c = (float)uVar94;
  fStack_888 = (float)uVar94;
  register0x0000149c = uVar94;
  auVar271 = ZEXT3264(_local_8a0);
  auVar8 = *(undefined1 (*) [16])(local_958 + uVar91 + 0x30);
  uVar94 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar275._4_4_ = uVar94;
  auVar275._0_4_ = uVar94;
  auVar275._8_4_ = uVar94;
  auVar275._12_4_ = uVar94;
  fStack_b10 = (float)uVar94;
  _local_b20 = auVar275;
  fStack_b0c = (float)uVar94;
  fStack_b08 = (float)uVar94;
  register0x000014dc = uVar94;
  auVar277 = ZEXT3264(_local_b20);
  auVar9 = vunpcklps_avx(auVar268,auVar275);
  fVar93 = *(float *)(ray + k * 4 + 0xc0);
  auVar278._4_4_ = fVar93;
  auVar278._0_4_ = fVar93;
  auVar278._8_4_ = fVar93;
  auVar278._12_4_ = fVar93;
  fStack_a90 = fVar93;
  _local_aa0 = auVar278;
  fStack_a8c = fVar93;
  fStack_a88 = fVar93;
  register0x0000151c = fVar93;
  auVar282 = ZEXT3264(_local_aa0);
  local_a50 = vinsertps_avx(auVar9,auVar278,0x28);
  auVar227._0_4_ = (auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_ + auVar8._0_4_) * 0.25;
  auVar227._4_4_ = (auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_ + auVar8._4_4_) * 0.25;
  auVar227._8_4_ = (auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_ + auVar8._8_4_) * 0.25;
  auVar227._12_4_ = (auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_ + auVar8._12_4_) * 0.25;
  auVar9 = vsubps_avx(auVar227,auVar10);
  auVar9 = vdpps_avx(auVar9,local_a50,0x7f);
  local_a60 = vdpps_avx(local_a50,local_a50,0x7f);
  auVar260 = ZEXT1664(local_a60);
  uVar87 = *(uint *)(local_950 + 2);
  auVar98 = vrcpss_avx(local_a60,local_a60);
  auVar97 = vfnmadd213ss_fma(auVar98,local_a60,ZEXT416(0x40000000));
  auVar244 = ZEXT1664(auVar97);
  local_2e0 = auVar9._0_4_ * auVar98._0_4_ * auVar97._0_4_;
  auVar235._4_4_ = local_2e0;
  auVar235._0_4_ = local_2e0;
  auVar235._8_4_ = local_2e0;
  auVar235._12_4_ = local_2e0;
  fStack_9b0 = local_2e0;
  _local_9c0 = auVar235;
  fStack_9ac = local_2e0;
  fStack_9a8 = local_2e0;
  fStack_9a4 = local_2e0;
  auVar9 = vfmadd231ps_fma(auVar10,local_a50,auVar235);
  auVar9 = vblendps_avx(auVar9,_DAT_01f7aa10,8);
  auVar10 = vsubps_avx(auVar5,auVar9);
  auVar7 = vsubps_avx(auVar7,auVar9);
  auVar98 = vsubps_avx(auVar6,auVar9);
  auVar8 = vsubps_avx(auVar8,auVar9);
  auVar5 = vmovshdup_avx(auVar10);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_220 = auVar5._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar5 = vmovshdup_avx(auVar98);
  local_500 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar98,auVar98,0xaa);
  local_240 = auVar5._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar5 = vshufps_avx(auVar98,auVar98,0xff);
  local_260 = auVar5._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar5 = vmovshdup_avx(auVar7);
  local_520 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar7,auVar7,0xaa);
  local_540 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar7,auVar7,0xff);
  local_560 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar8);
  local_580 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_5a0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_5c0 = auVar5._0_8_;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar93 * fVar93)),_local_b20,_local_b20);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_8a0,_local_8a0);
  uVar94 = auVar5._0_4_;
  auVar173._4_4_ = uVar94;
  auVar173._0_4_ = uVar94;
  auVar173._8_4_ = uVar94;
  auVar173._12_4_ = uVar94;
  auVar173._16_4_ = uVar94;
  auVar173._20_4_ = uVar94;
  auVar173._24_4_ = uVar94;
  auVar173._28_4_ = uVar94;
  fVar93 = *(float *)(ray + k * 4 + 0x60);
  local_970 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar93 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  local_ccc = 1;
  uVar91 = 0;
  bVar90 = false;
  local_5e0 = auVar10._0_4_;
  local_2a0 = auVar98._0_4_;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_290 = local_2a0;
  uStack_28c = local_2a0;
  uStack_288 = local_2a0;
  uStack_284 = local_2a0;
  local_600 = auVar7._0_4_;
  fVar129 = auVar8._0_4_;
  auVar12._4_4_ = uStack_8fc;
  auVar12._0_4_ = local_900;
  auVar12._8_4_ = uStack_8f8;
  auVar12._12_4_ = uStack_8f4;
  auVar12._16_4_ = uStack_8f0;
  auVar12._20_4_ = uStack_8ec;
  auVar12._24_4_ = uStack_8e8;
  auVar12._28_4_ = uStack_8e4;
  local_640 = vandps_avx(auVar173,auVar12);
  auVar5 = vsqrtss_avx(local_a60,local_a60);
  auVar6 = vsqrtss_avx(local_a60,local_a60);
  local_6b0 = ZEXT816(0x3f80000000000000);
  local_280 = auVar173;
  uStack_67c = local_680;
  uStack_678 = local_680;
  uStack_674 = local_680;
  uStack_670 = local_680;
  uStack_66c = local_680;
  uStack_668 = local_680;
  uStack_664 = local_680;
  local_660 = uVar87;
  uStack_65c = uVar87;
  uStack_658 = uVar87;
  uStack_654 = uVar87;
  uStack_650 = uVar87;
  uStack_64c = uVar87;
  uStack_648 = uVar87;
  uStack_644 = uVar87;
  local_620 = fVar129;
  fStack_61c = fVar129;
  fStack_618 = fVar129;
  fStack_614 = fVar129;
  fStack_610 = fVar129;
  fStack_60c = fVar129;
  fStack_608 = fVar129;
  fStack_604 = fVar129;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  do {
    iVar83 = (int)uVar91;
    auVar9 = vmovshdup_avx(local_6b0);
    auVar9 = vsubps_avx(auVar9,local_6b0);
    local_880._0_4_ = auVar9._0_4_;
    fVar222 = local_880._0_4_ * 0.04761905;
    uVar94 = local_6b0._0_4_;
    local_860._4_4_ = uVar94;
    local_860._0_4_ = uVar94;
    local_860._8_4_ = uVar94;
    local_860._12_4_ = uVar94;
    local_860._16_4_ = uVar94;
    local_860._20_4_ = uVar94;
    local_860._24_4_ = uVar94;
    local_860._28_4_ = uVar94;
    local_880._4_4_ = local_880._0_4_;
    local_880._8_4_ = local_880._0_4_;
    local_880._12_4_ = local_880._0_4_;
    local_880._16_4_ = local_880._0_4_;
    local_880._20_4_ = local_880._0_4_;
    local_880._24_4_ = local_880._0_4_;
    local_880._28_4_ = local_880._0_4_;
    auVar9 = vfmadd231ps_fma(local_860,local_880,_DAT_01faff20);
    auVar113._8_4_ = 0x3f800000;
    auVar113._0_8_ = 0x3f8000003f800000;
    auVar113._12_4_ = 0x3f800000;
    auVar113._16_4_ = 0x3f800000;
    auVar113._20_4_ = 0x3f800000;
    auVar113._24_4_ = 0x3f800000;
    auVar113._28_4_ = 0x3f800000;
    auVar111 = vsubps_avx(auVar113,ZEXT1632(auVar9));
    fVar201 = auVar111._0_4_;
    fVar218 = auVar111._4_4_;
    fVar217 = auVar111._8_4_;
    fVar256 = auVar111._12_4_;
    fVar219 = auVar111._16_4_;
    fVar273 = auVar111._20_4_;
    fVar223 = auVar111._24_4_;
    fVar95 = fVar201 * fVar201 * fVar201;
    fVar130 = fVar218 * fVar218 * fVar218;
    fVar131 = fVar217 * fVar217 * fVar217;
    fVar132 = fVar256 * fVar256 * fVar256;
    fVar133 = fVar219 * fVar219 * fVar219;
    fVar134 = fVar273 * fVar273 * fVar273;
    fVar135 = fVar223 * fVar223 * fVar223;
    fVar215 = auVar9._0_4_;
    fVar221 = auVar9._4_4_;
    fVar216 = auVar9._8_4_;
    fVar220 = auVar9._12_4_;
    fVar153 = fVar215 * fVar215 * fVar215;
    fVar177 = fVar221 * fVar221 * fVar221;
    fVar178 = fVar216 * fVar216 * fVar216;
    fVar179 = fVar220 * fVar220 * fVar220;
    fVar257 = fVar201 * fVar215;
    fVar261 = fVar218 * fVar221;
    fVar262 = fVar217 * fVar216;
    fVar263 = fVar256 * fVar220;
    fVar264 = fVar219 * 0.0;
    fVar265 = fVar273 * 0.0;
    fVar266 = fVar223 * 0.0;
    fVar272 = auVar271._28_4_ + auVar282._28_4_;
    auVar14._4_4_ = fVar130 * 0.16666667;
    auVar14._0_4_ = fVar95 * 0.16666667;
    auVar14._8_4_ = fVar131 * 0.16666667;
    auVar14._12_4_ = fVar132 * 0.16666667;
    auVar14._16_4_ = fVar133 * 0.16666667;
    auVar14._20_4_ = fVar134 * 0.16666667;
    auVar14._24_4_ = fVar135 * 0.16666667;
    auVar14._28_4_ = fVar272 + 1.0;
    auVar121._4_4_ =
         (fVar218 * fVar261 * 12.0 + fVar261 * fVar221 * 6.0 + fVar177 + fVar130 * 4.0) * 0.16666667
    ;
    auVar121._0_4_ =
         (fVar201 * fVar257 * 12.0 + fVar257 * fVar215 * 6.0 + fVar153 + fVar95 * 4.0) * 0.16666667;
    auVar121._8_4_ =
         (fVar217 * fVar262 * 12.0 + fVar262 * fVar216 * 6.0 + fVar178 + fVar131 * 4.0) * 0.16666667
    ;
    auVar121._12_4_ =
         (fVar256 * fVar263 * 12.0 + fVar263 * fVar220 * 6.0 + fVar179 + fVar132 * 4.0) * 0.16666667
    ;
    auVar121._16_4_ =
         (fVar219 * fVar264 * 12.0 + fVar264 * 0.0 * 6.0 + fVar133 * 4.0 + 0.0) * 0.16666667;
    auVar121._20_4_ =
         (fVar273 * fVar265 * 12.0 + fVar265 * 0.0 * 6.0 + fVar134 * 4.0 + 0.0) * 0.16666667;
    auVar121._24_4_ =
         (fVar223 * fVar266 * 12.0 + fVar266 * 0.0 * 6.0 + fVar135 * 4.0 + 0.0) * 0.16666667;
    auVar121._28_4_ = auVar277._28_4_;
    auVar15._4_4_ =
         (fVar177 * 4.0 + fVar130 + fVar261 * fVar221 * 12.0 + fVar218 * fVar261 * 6.0) * 0.16666667
    ;
    auVar15._0_4_ =
         (fVar153 * 4.0 + fVar95 + fVar257 * fVar215 * 12.0 + fVar201 * fVar257 * 6.0) * 0.16666667;
    auVar15._8_4_ =
         (fVar178 * 4.0 + fVar131 + fVar262 * fVar216 * 12.0 + fVar217 * fVar262 * 6.0) * 0.16666667
    ;
    auVar15._12_4_ =
         (fVar179 * 4.0 + fVar132 + fVar263 * fVar220 * 12.0 + fVar256 * fVar263 * 6.0) * 0.16666667
    ;
    auVar15._16_4_ = (fVar133 + 0.0 + fVar264 * 0.0 * 12.0 + fVar219 * fVar264 * 6.0) * 0.16666667;
    auVar15._20_4_ = (fVar134 + 0.0 + fVar265 * 0.0 * 12.0 + fVar273 * fVar265 * 6.0) * 0.16666667;
    auVar15._24_4_ = (fVar135 + 0.0 + fVar266 * 0.0 * 12.0 + fVar223 * fVar266 * 6.0) * 0.16666667;
    auVar15._28_4_ = auVar282._28_4_;
    fVar153 = fVar153 * 0.16666667;
    fVar177 = fVar177 * 0.16666667;
    fVar178 = fVar178 * 0.16666667;
    fVar179 = fVar179 * 0.16666667;
    auVar116._4_4_ = fVar177 * fStack_61c;
    auVar116._0_4_ = fVar153 * local_620;
    auVar116._8_4_ = fVar178 * fStack_618;
    auVar116._12_4_ = fVar179 * fStack_614;
    auVar116._16_4_ = fStack_610 * 0.0;
    auVar116._20_4_ = fStack_60c * 0.0;
    auVar116._24_4_ = fStack_608 * 0.0;
    auVar116._28_4_ = 0x3f800000;
    auVar16._4_4_ = fVar177 * local_580._4_4_;
    auVar16._0_4_ = fVar153 * (float)local_580;
    auVar16._8_4_ = fVar178 * (float)uStack_578;
    auVar16._12_4_ = fVar179 * uStack_578._4_4_;
    auVar16._16_4_ = (float)uStack_570 * 0.0;
    auVar16._20_4_ = uStack_570._4_4_ * 0.0;
    auVar16._24_4_ = (float)uStack_568 * 0.0;
    auVar16._28_4_ = fVar272 + DAT_01faff20._28_4_ + 0.0;
    auVar144._4_4_ = fVar177 * local_5a0._4_4_;
    auVar144._0_4_ = fVar153 * (float)local_5a0;
    auVar144._8_4_ = fVar178 * (float)uStack_598;
    auVar144._12_4_ = fVar179 * uStack_598._4_4_;
    auVar144._16_4_ = (float)uStack_590 * 0.0;
    auVar144._20_4_ = uStack_590._4_4_ * 0.0;
    auVar144._24_4_ = (float)uStack_588 * 0.0;
    auVar144._28_4_ = 0;
    auVar17._4_4_ = fVar177 * local_5c0._4_4_;
    auVar17._0_4_ = fVar153 * (float)local_5c0;
    auVar17._8_4_ = fVar178 * (float)uStack_5b8;
    auVar17._12_4_ = fVar179 * uStack_5b8._4_4_;
    auVar17._16_4_ = (float)uStack_5b0 * 0.0;
    auVar17._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar17._24_4_ = (float)uStack_5a8 * 0.0;
    auVar17._28_4_ = 0x3e2aaaab;
    auVar114._4_4_ = uStack_5fc;
    auVar114._0_4_ = local_600;
    auVar114._8_4_ = uStack_5f8;
    auVar114._12_4_ = uStack_5f4;
    auVar114._16_4_ = uStack_5f0;
    auVar114._20_4_ = uStack_5ec;
    auVar114._24_4_ = uStack_5e8;
    auVar114._28_4_ = uStack_5e4;
    auVar9 = vfmadd231ps_fma(auVar116,auVar15,auVar114);
    auVar69._8_8_ = uStack_518;
    auVar69._0_8_ = local_520;
    auVar69._16_8_ = uStack_510;
    auVar69._24_8_ = uStack_508;
    auVar97 = vfmadd231ps_fma(auVar16,auVar15,auVar69);
    auVar67._8_8_ = uStack_538;
    auVar67._0_8_ = local_540;
    auVar67._16_8_ = uStack_530;
    auVar67._24_8_ = uStack_528;
    auVar154 = vfmadd231ps_fma(auVar144,auVar15,auVar67);
    auVar65._8_8_ = uStack_558;
    auVar65._0_8_ = local_560;
    auVar65._16_8_ = uStack_550;
    auVar65._24_8_ = uStack_548;
    auVar105 = vfmadd231ps_fma(auVar17,auVar15,auVar65);
    auVar76._4_4_ = uStack_29c;
    auVar76._0_4_ = local_2a0;
    auVar76._8_4_ = uStack_298;
    auVar76._12_4_ = uStack_294;
    auVar76._16_4_ = uStack_290;
    auVar76._20_4_ = uStack_28c;
    auVar76._24_4_ = uStack_288;
    auVar76._28_4_ = uStack_284;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,auVar76);
    auVar71._8_8_ = uStack_4f8;
    auVar71._0_8_ = local_500;
    auVar71._16_8_ = uStack_4f0;
    auVar71._24_8_ = uStack_4e8;
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar121,auVar71);
    auVar78._8_8_ = uStack_238;
    auVar78._0_8_ = local_240;
    auVar78._16_8_ = uStack_230;
    auVar78._24_8_ = uStack_228;
    auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar121,auVar78);
    auVar77._8_8_ = uStack_258;
    auVar77._0_8_ = local_260;
    auVar77._16_8_ = uStack_250;
    auVar77._24_8_ = uStack_248;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar77,auVar121);
    auVar63._4_4_ = uStack_5dc;
    auVar63._0_4_ = local_5e0;
    auVar63._8_4_ = uStack_5d8;
    auVar63._12_4_ = uStack_5d4;
    auVar63._16_4_ = uStack_5d0;
    auVar63._20_4_ = uStack_5cc;
    auVar63._24_4_ = uStack_5c8;
    auVar63._28_4_ = uStack_5c4;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar14,auVar63);
    auVar114 = ZEXT1632(auVar9);
    auVar81._8_8_ = uStack_1d8;
    auVar81._0_8_ = local_1e0;
    auVar81._16_8_ = uStack_1d0;
    auVar81._24_8_ = uStack_1c8;
    auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar14,auVar81);
    local_a00 = ZEXT1632(auVar97);
    auVar80._8_8_ = uStack_1f8;
    auVar80._0_8_ = local_200;
    auVar80._16_8_ = uStack_1f0;
    auVar80._24_8_ = uStack_1e8;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar14,auVar80);
    auVar79._8_8_ = uStack_218;
    auVar79._0_8_ = local_220;
    auVar79._16_8_ = uStack_210;
    auVar79._24_8_ = uStack_208;
    auVar154 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar79,auVar14);
    auVar236._0_4_ = (float)((uint)fVar215 ^ local_800) * fVar215;
    auVar236._4_4_ = (float)((uint)fVar221 ^ uStack_7fc) * fVar221;
    auVar236._8_4_ = (float)((uint)fVar216 ^ uStack_7f8) * fVar216;
    auVar236._12_4_ = (float)((uint)fVar220 ^ uStack_7f4) * fVar220;
    auVar236._16_4_ = fStack_7f0 * 0.0;
    auVar236._20_4_ = fStack_7ec * 0.0;
    auVar236._24_4_ = fStack_7e8 * 0.0;
    auVar236._28_4_ = 0;
    auVar213._4_4_ = fVar261 * 4.0;
    auVar213._0_4_ = fVar257 * 4.0;
    auVar213._8_4_ = fVar262 * 4.0;
    auVar213._12_4_ = fVar263 * 4.0;
    auVar213._16_4_ = fVar264 * 4.0;
    auVar213._20_4_ = fVar265 * 4.0;
    fVar95 = auVar260._28_4_;
    auVar213._24_4_ = fVar266 * 4.0;
    auVar213._28_4_ = fVar95;
    auVar112 = vsubps_avx(auVar236,auVar213);
    auVar18._4_4_ = fVar218 * (float)((uint)fVar218 ^ uStack_7fc) * 0.5;
    auVar18._0_4_ = fVar201 * (float)((uint)fVar201 ^ local_800) * 0.5;
    auVar18._8_4_ = fVar217 * (float)((uint)fVar217 ^ uStack_7f8) * 0.5;
    auVar18._12_4_ = fVar256 * (float)((uint)fVar256 ^ uStack_7f4) * 0.5;
    auVar18._16_4_ = fVar219 * (float)((uint)fVar219 ^ (uint)fStack_7f0) * 0.5;
    auVar18._20_4_ = fVar273 * (float)((uint)fVar273 ^ (uint)fStack_7ec) * 0.5;
    auVar18._24_4_ = fVar223 * (float)((uint)fVar223 ^ (uint)fStack_7e8) * 0.5;
    auVar18._28_4_ = auVar111._28_4_;
    auVar19._4_4_ = auVar112._4_4_ * 0.5;
    auVar19._0_4_ = auVar112._0_4_ * 0.5;
    auVar19._8_4_ = auVar112._8_4_ * 0.5;
    auVar19._12_4_ = auVar112._12_4_ * 0.5;
    auVar19._16_4_ = auVar112._16_4_ * 0.5;
    auVar19._20_4_ = auVar112._20_4_ * 0.5;
    auVar19._24_4_ = auVar112._24_4_ * 0.5;
    auVar19._28_4_ = auVar112._28_4_;
    auVar20._4_4_ = (fVar261 * 4.0 + fVar218 * fVar218) * 0.5;
    auVar20._0_4_ = (fVar257 * 4.0 + fVar201 * fVar201) * 0.5;
    auVar20._8_4_ = (fVar262 * 4.0 + fVar217 * fVar217) * 0.5;
    auVar20._12_4_ = (fVar263 * 4.0 + fVar256 * fVar256) * 0.5;
    auVar20._16_4_ = (fVar264 * 4.0 + fVar219 * fVar219) * 0.5;
    auVar20._20_4_ = (fVar265 * 4.0 + fVar273 * fVar273) * 0.5;
    auVar20._24_4_ = (fVar266 * 4.0 + fVar223 * fVar223) * 0.5;
    auVar20._28_4_ = fVar95 + auVar244._28_4_;
    fVar201 = fVar215 * fVar215 * 0.5;
    fVar215 = fVar221 * fVar221 * 0.5;
    fVar218 = fVar216 * fVar216 * 0.5;
    fVar221 = fVar220 * fVar220 * 0.5;
    auVar117._4_4_ = fVar215 * fStack_61c;
    auVar117._0_4_ = fVar201 * local_620;
    auVar117._8_4_ = fVar218 * fStack_618;
    auVar117._12_4_ = fVar221 * fStack_614;
    auVar117._16_4_ = fStack_610 * 0.0;
    auVar117._20_4_ = fStack_60c * 0.0;
    auVar117._24_4_ = fStack_608 * 0.0;
    auVar117._28_4_ = fVar95;
    auVar167._4_4_ = fVar215 * local_580._4_4_;
    auVar167._0_4_ = fVar201 * (float)local_580;
    auVar167._8_4_ = fVar218 * (float)uStack_578;
    auVar167._12_4_ = fVar221 * uStack_578._4_4_;
    auVar167._16_4_ = (float)uStack_570 * 0.0;
    auVar167._20_4_ = uStack_570._4_4_ * 0.0;
    auVar167._24_4_ = (float)uStack_568 * 0.0;
    auVar167._28_4_ = uStack_7e4;
    auVar276._4_4_ = fVar215 * local_5a0._4_4_;
    auVar276._0_4_ = fVar201 * (float)local_5a0;
    auVar276._8_4_ = fVar218 * (float)uStack_598;
    auVar276._12_4_ = fVar221 * uStack_598._4_4_;
    auVar276._16_4_ = (float)uStack_590 * 0.0;
    auVar276._20_4_ = uStack_590._4_4_ * 0.0;
    auVar276._24_4_ = (float)uStack_588 * 0.0;
    auVar276._28_4_ = auVar277._28_4_;
    auVar294._4_4_ = fVar215 * local_5c0._4_4_;
    auVar294._0_4_ = fVar201 * (float)local_5c0;
    auVar294._8_4_ = fVar218 * (float)uStack_5b8;
    auVar294._12_4_ = fVar221 * uStack_5b8._4_4_;
    auVar294._16_4_ = (float)uStack_5b0 * 0.0;
    auVar294._20_4_ = uStack_5b0._4_4_ * 0.0;
    auVar294._24_4_ = (float)uStack_5a8 * 0.0;
    auVar294._28_4_ = auVar173._28_4_;
    auVar62._4_4_ = uStack_5fc;
    auVar62._0_4_ = local_600;
    auVar62._8_4_ = uStack_5f8;
    auVar62._12_4_ = uStack_5f4;
    auVar62._16_4_ = uStack_5f0;
    auVar62._20_4_ = uStack_5ec;
    auVar62._24_4_ = uStack_5e8;
    auVar62._28_4_ = uStack_5e4;
    auVar105 = vfmadd231ps_fma(auVar117,auVar20,auVar62);
    auVar70._8_8_ = uStack_518;
    auVar70._0_8_ = local_520;
    auVar70._16_8_ = uStack_510;
    auVar70._24_8_ = uStack_508;
    auVar100 = vfmadd231ps_fma(auVar167,auVar20,auVar70);
    auVar68._8_8_ = uStack_538;
    auVar68._0_8_ = local_540;
    auVar68._16_8_ = uStack_530;
    auVar68._24_8_ = uStack_528;
    auVar137 = vfmadd231ps_fma(auVar276,auVar20,auVar68);
    auVar66._8_8_ = uStack_558;
    auVar66._0_8_ = local_560;
    auVar66._16_8_ = uStack_550;
    auVar66._24_8_ = uStack_548;
    auVar164 = vfmadd231ps_fma(auVar294,auVar20,auVar66);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar19,auVar76);
    auVar72._8_8_ = uStack_4f8;
    auVar72._0_8_ = local_500;
    auVar72._16_8_ = uStack_4f0;
    auVar72._24_8_ = uStack_4e8;
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar19,auVar72);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar19,auVar78);
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar77,auVar19);
    auVar64._4_4_ = uStack_5dc;
    auVar64._0_4_ = local_5e0;
    auVar64._8_4_ = uStack_5d8;
    auVar64._12_4_ = uStack_5d4;
    auVar64._16_4_ = uStack_5d0;
    auVar64._20_4_ = uStack_5cc;
    auVar64._24_4_ = uStack_5c8;
    auVar64._28_4_ = uStack_5c4;
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar18,auVar64);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar18,auVar81);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar18,auVar80);
    auVar164 = vfmadd231ps_fma(ZEXT1632(auVar164),auVar79,auVar18);
    local_a80._0_4_ = auVar105._0_4_ * fVar222;
    local_a80._4_4_ = auVar105._4_4_ * fVar222;
    local_a80._8_4_ = auVar105._8_4_ * fVar222;
    local_a80._12_4_ = auVar105._12_4_ * fVar222;
    local_a80._16_4_ = fVar222 * 0.0;
    local_a80._20_4_ = fVar222 * 0.0;
    local_a80._24_4_ = fVar222 * 0.0;
    local_a80._28_4_ = 0;
    fVar201 = auVar100._0_4_ * fVar222;
    fVar215 = auVar100._4_4_ * fVar222;
    auVar241._4_4_ = fVar215;
    auVar241._0_4_ = fVar201;
    fVar218 = auVar100._8_4_ * fVar222;
    auVar241._8_4_ = fVar218;
    fVar221 = auVar100._12_4_ * fVar222;
    auVar241._12_4_ = fVar221;
    auVar241._16_4_ = fVar222 * 0.0;
    auVar241._20_4_ = fVar222 * 0.0;
    auVar241._24_4_ = fVar222 * 0.0;
    auVar241._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    fVar132 = auVar137._0_4_ * fVar222;
    fVar133 = auVar137._4_4_ * fVar222;
    local_ac0._4_4_ = fVar133;
    local_ac0._0_4_ = fVar132;
    fVar134 = auVar137._8_4_ * fVar222;
    local_ac0._8_4_ = fVar134;
    fVar135 = auVar137._12_4_ * fVar222;
    local_ac0._12_4_ = fVar135;
    fVar153 = fVar222 * 0.0;
    local_ac0._16_4_ = fVar153;
    fVar177 = fVar222 * 0.0;
    local_ac0._20_4_ = fVar177;
    fVar178 = fVar222 * 0.0;
    local_ac0._24_4_ = fVar178;
    local_ac0._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar211._0_4_ = fVar222 * auVar164._0_4_;
    auVar211._4_4_ = fVar222 * auVar164._4_4_;
    auVar211._8_4_ = fVar222 * auVar164._8_4_;
    auVar211._12_4_ = fVar222 * auVar164._12_4_;
    auVar211._16_4_ = fVar222 * 0.0;
    auVar211._20_4_ = fVar222 * 0.0;
    auVar211._24_4_ = fVar222 * 0.0;
    auVar211._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar114);
    local_840 = vpermps_avx2(_DAT_01fec480,local_a00);
    auVar167 = ZEXT1632(auVar9);
    auVar213 = vpermps_avx2(_DAT_01fec480,auVar167);
    auVar14 = vsubps_avx(auVar17,auVar114);
    auVar121 = vsubps_avx(auVar213,ZEXT1632(auVar9));
    fVar220 = auVar121._0_4_;
    fVar219 = auVar121._4_4_;
    auVar296._4_4_ = fVar219 * local_a80._4_4_;
    auVar296._0_4_ = fVar220 * (float)local_a80._0_4_;
    fVar223 = auVar121._8_4_;
    auVar296._8_4_ = fVar223 * local_a80._8_4_;
    fVar95 = auVar121._12_4_;
    auVar296._12_4_ = fVar95 * local_a80._12_4_;
    fVar130 = auVar121._16_4_;
    auVar296._16_4_ = fVar130 * local_a80._16_4_;
    fVar131 = auVar121._20_4_;
    auVar296._20_4_ = fVar131 * local_a80._20_4_;
    fVar179 = auVar121._24_4_;
    auVar296._24_4_ = fVar179 * local_a80._24_4_;
    auVar296._28_4_ = auVar17._28_4_;
    auVar9 = vfmsub231ps_fma(auVar296,local_ac0,auVar14);
    auVar15 = vsubps_avx(local_840,local_a00);
    fVar265 = auVar14._0_4_;
    fVar266 = auVar14._4_4_;
    auVar11._4_4_ = fVar266 * fVar215;
    auVar11._0_4_ = fVar265 * fVar201;
    fVar272 = auVar14._8_4_;
    auVar11._8_4_ = fVar272 * fVar218;
    fVar283 = auVar14._12_4_;
    auVar11._12_4_ = fVar283 * fVar221;
    fVar284 = auVar14._16_4_;
    auVar11._16_4_ = fVar284 * fVar222 * 0.0;
    fVar285 = auVar14._20_4_;
    auVar11._20_4_ = fVar285 * fVar222 * 0.0;
    fVar286 = auVar14._24_4_;
    auVar11._24_4_ = fVar286 * fVar222 * 0.0;
    auVar11._28_4_ = auVar213._28_4_;
    auVar105 = vfmsub231ps_fma(auVar11,local_a80,auVar15);
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar105._12_4_ * auVar105._12_4_,
                                                CONCAT48(auVar105._8_4_ * auVar105._8_4_,
                                                         CONCAT44(auVar105._4_4_ * auVar105._4_4_,
                                                                  auVar105._0_4_ * auVar105._0_4_)))
                                     ),ZEXT1632(auVar9),ZEXT1632(auVar9));
    fVar273 = auVar15._0_4_;
    fVar222 = auVar15._4_4_;
    auVar13._4_4_ = fVar222 * fVar133;
    auVar13._0_4_ = fVar273 * fVar132;
    fVar257 = auVar15._8_4_;
    auVar13._8_4_ = fVar257 * fVar134;
    fVar261 = auVar15._12_4_;
    auVar13._12_4_ = fVar261 * fVar135;
    fVar262 = auVar15._16_4_;
    auVar13._16_4_ = fVar262 * fVar153;
    fVar263 = auVar15._20_4_;
    auVar13._20_4_ = fVar263 * fVar177;
    fVar264 = auVar15._24_4_;
    auVar13._24_4_ = fVar264 * fVar178;
    auVar13._28_4_ = 0;
    auVar100 = vfmsub231ps_fma(auVar13,auVar241,auVar121);
    auVar194._0_4_ = fVar220 * fVar220;
    auVar194._4_4_ = fVar219 * fVar219;
    auVar194._8_4_ = fVar223 * fVar223;
    auVar194._12_4_ = fVar95 * fVar95;
    auVar194._16_4_ = fVar130 * fVar130;
    auVar194._20_4_ = fVar131 * fVar131;
    auVar194._24_4_ = fVar179 * fVar179;
    auVar194._28_4_ = 0;
    auVar105 = vfmadd231ps_fma(auVar194,auVar15,auVar15);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar14,auVar14);
    auVar111 = vrcpps_avx(ZEXT1632(auVar105));
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar100),ZEXT1632(auVar100));
    auVar232._8_4_ = 0x3f800000;
    auVar232._0_8_ = 0x3f8000003f800000;
    auVar232._12_4_ = 0x3f800000;
    auVar232._16_4_ = 0x3f800000;
    auVar232._20_4_ = 0x3f800000;
    auVar232._24_4_ = 0x3f800000;
    auVar232._28_4_ = 0x3f800000;
    auVar9 = vfnmadd213ps_fma(auVar111,ZEXT1632(auVar105),auVar232);
    auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar111,auVar111);
    auVar18 = vpermps_avx2(_DAT_01fec480,local_a80);
    local_ae0 = vpermps_avx2(_DAT_01fec480,local_ac0);
    auVar23._4_4_ = fVar219 * auVar18._4_4_;
    auVar23._0_4_ = fVar220 * auVar18._0_4_;
    auVar23._8_4_ = fVar223 * auVar18._8_4_;
    auVar23._12_4_ = fVar95 * auVar18._12_4_;
    auVar23._16_4_ = fVar130 * auVar18._16_4_;
    auVar23._20_4_ = fVar131 * auVar18._20_4_;
    auVar23._24_4_ = fVar179 * auVar18._24_4_;
    auVar23._28_4_ = auVar111._28_4_;
    auVar137 = vfmsub231ps_fma(auVar23,local_ae0,auVar14);
    local_9e0 = vpermps_avx2(_DAT_01fec480,auVar241);
    auVar24._4_4_ = fVar266 * local_9e0._4_4_;
    auVar24._0_4_ = fVar265 * local_9e0._0_4_;
    auVar24._8_4_ = fVar272 * local_9e0._8_4_;
    auVar24._12_4_ = fVar283 * local_9e0._12_4_;
    auVar24._16_4_ = fVar284 * local_9e0._16_4_;
    auVar24._20_4_ = fVar285 * local_9e0._20_4_;
    auVar24._24_4_ = fVar286 * local_9e0._24_4_;
    auVar24._28_4_ = 0;
    auVar164 = vfmsub231ps_fma(auVar24,auVar18,auVar15);
    auVar137 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                                  CONCAT48(auVar164._8_4_ * auVar164._8_4_,
                                                           CONCAT44(auVar164._4_4_ * auVar164._4_4_,
                                                                    auVar164._0_4_ * auVar164._0_4_)
                                                          ))),ZEXT1632(auVar137),ZEXT1632(auVar137))
    ;
    auVar248._0_4_ = fVar273 * local_ae0._0_4_;
    auVar248._4_4_ = fVar222 * local_ae0._4_4_;
    auVar248._8_4_ = fVar257 * local_ae0._8_4_;
    auVar248._12_4_ = fVar261 * local_ae0._12_4_;
    auVar248._16_4_ = fVar262 * local_ae0._16_4_;
    auVar248._20_4_ = fVar263 * local_ae0._20_4_;
    auVar248._24_4_ = fVar264 * local_ae0._24_4_;
    auVar248._28_4_ = 0;
    auVar164 = vfmsub231ps_fma(auVar248,local_9e0,auVar121);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),ZEXT1632(auVar164),ZEXT1632(auVar164));
    auVar111 = vmaxps_avx(ZEXT1632(CONCAT412(auVar100._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar100._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar100._4_4_ * auVar9._4_4_,
                                                               auVar100._0_4_ * auVar9._0_4_)))),
                          ZEXT1632(CONCAT412(auVar137._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar137._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar137._4_4_ * auVar9._4_4_,
                                                               auVar137._0_4_ * auVar9._0_4_)))));
    auVar233._0_4_ = auVar154._0_4_ + auVar211._0_4_;
    auVar233._4_4_ = auVar154._4_4_ + auVar211._4_4_;
    auVar233._8_4_ = auVar154._8_4_ + auVar211._8_4_;
    auVar233._12_4_ = auVar154._12_4_ + auVar211._12_4_;
    auVar233._16_4_ = auVar211._16_4_ + 0.0;
    auVar233._20_4_ = auVar211._20_4_ + 0.0;
    auVar233._24_4_ = auVar211._24_4_ + 0.0;
    auVar233._28_4_ = 0;
    auVar294 = ZEXT1632(auVar154);
    auVar173 = vsubps_avx(auVar294,auVar211);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar173);
    auVar20 = vpermps_avx2(_DAT_01fec480,auVar294);
    auVar173 = vmaxps_avx(auVar294,auVar233);
    auVar112 = vmaxps_avx(auVar19,auVar20);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar105));
    auVar173 = vmaxps_avx(auVar173,auVar112);
    fVar201 = auVar12._0_4_;
    fVar215 = auVar12._4_4_;
    fVar218 = auVar12._8_4_;
    fVar221 = auVar12._12_4_;
    fVar217 = auVar12._16_4_;
    fVar216 = auVar12._20_4_;
    fVar256 = auVar12._24_4_;
    auVar25._4_4_ = fVar215 * fVar215 * fVar215 * auVar105._4_4_ * -0.5;
    auVar25._0_4_ = fVar201 * fVar201 * fVar201 * auVar105._0_4_ * -0.5;
    auVar25._8_4_ = fVar218 * fVar218 * fVar218 * auVar105._8_4_ * -0.5;
    auVar25._12_4_ = fVar221 * fVar221 * fVar221 * auVar105._12_4_ * -0.5;
    auVar25._16_4_ = fVar217 * fVar217 * fVar217 * -0.0;
    auVar25._20_4_ = fVar216 * fVar216 * fVar216 * -0.0;
    auVar25._24_4_ = fVar256 * fVar256 * fVar256 * -0.0;
    auVar25._28_4_ = 0;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar9 = vfmadd231ps_fma(auVar25,auVar115,auVar12);
    fVar215 = auVar9._0_4_;
    fVar221 = auVar9._4_4_;
    auVar26._4_4_ = fVar222 * fVar221;
    auVar26._0_4_ = fVar273 * fVar215;
    fVar256 = auVar9._8_4_;
    auVar26._8_4_ = fVar257 * fVar256;
    fVar273 = auVar9._12_4_;
    auVar26._12_4_ = fVar261 * fVar273;
    auVar26._16_4_ = fVar262 * 0.0;
    auVar26._20_4_ = fVar263 * 0.0;
    auVar26._24_4_ = fVar264 * 0.0;
    auVar26._28_4_ = 0;
    auVar27._4_4_ = (float)local_aa0._4_4_ * fVar219 * fVar221;
    auVar27._0_4_ = (float)local_aa0._0_4_ * fVar220 * fVar215;
    auVar27._8_4_ = fStack_a98 * fVar223 * fVar256;
    auVar27._12_4_ = fStack_a94 * fVar95 * fVar273;
    auVar27._16_4_ = fStack_a90 * fVar130 * 0.0;
    auVar27._20_4_ = fStack_a8c * fVar131 * 0.0;
    auVar27._24_4_ = fStack_a88 * fVar179 * 0.0;
    auVar27._28_4_ = auVar15._28_4_;
    auVar154 = vfmadd231ps_fma(auVar27,auVar26,_local_b20);
    auVar116 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar112 = vsubps_avx(auVar116,auVar167);
    fVar218 = auVar112._0_4_;
    fVar217 = auVar112._4_4_;
    auVar28._4_4_ = fVar219 * fVar221 * fVar217;
    auVar28._0_4_ = fVar220 * fVar215 * fVar218;
    fVar220 = auVar112._8_4_;
    auVar28._8_4_ = fVar223 * fVar256 * fVar220;
    fVar223 = auVar112._12_4_;
    auVar28._12_4_ = fVar95 * fVar273 * fVar223;
    fVar95 = auVar112._16_4_;
    auVar28._16_4_ = fVar130 * 0.0 * fVar95;
    fVar130 = auVar112._20_4_;
    auVar28._20_4_ = fVar131 * 0.0 * fVar130;
    fVar131 = auVar112._24_4_;
    auVar28._24_4_ = fVar179 * 0.0 * fVar131;
    auVar28._28_4_ = local_9e0._28_4_;
    auVar116 = vsubps_avx(auVar116,local_a00);
    auVar271 = ZEXT3264(auVar116);
    auVar105 = vfmadd231ps_fma(auVar28,auVar116,auVar26);
    auVar29._4_4_ = fVar266 * fVar221;
    auVar29._0_4_ = fVar265 * fVar215;
    auVar29._8_4_ = fVar272 * fVar256;
    auVar29._12_4_ = fVar283 * fVar273;
    auVar29._16_4_ = fVar284 * 0.0;
    auVar29._20_4_ = fVar285 * 0.0;
    auVar29._24_4_ = fVar286 * 0.0;
    auVar29._28_4_ = 0;
    auVar154 = vfmadd231ps_fma(ZEXT1632(auVar154),auVar29,_local_8a0);
    auVar277 = ZEXT1664(auVar154);
    auVar117 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar16 = vsubps_avx(auVar117,auVar114);
    auVar282 = ZEXT3264(auVar16);
    auVar105 = vfmadd231ps_fma(ZEXT1632(auVar105),auVar16,auVar29);
    auVar30._4_4_ = (float)local_aa0._4_4_ * fVar217;
    auVar30._0_4_ = (float)local_aa0._0_4_ * fVar218;
    auVar30._8_4_ = fStack_a98 * fVar220;
    auVar30._12_4_ = fStack_a94 * fVar223;
    auVar30._16_4_ = fStack_a90 * fVar95;
    auVar30._20_4_ = fStack_a8c * fVar130;
    auVar30._24_4_ = fStack_a88 * fVar131;
    auVar30._28_4_ = 0;
    auVar100 = vfmadd231ps_fma(auVar30,_local_b20,auVar116);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),_local_8a0,auVar16);
    fVar201 = auVar105._0_4_;
    fVar263 = auVar154._0_4_;
    fVar216 = auVar105._4_4_;
    fVar264 = auVar154._4_4_;
    fVar219 = auVar105._8_4_;
    fVar265 = auVar154._8_4_;
    fVar222 = auVar105._12_4_;
    fVar266 = auVar154._12_4_;
    auVar31._28_4_ = auVar12._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar222,
                            CONCAT48(fVar265 * fVar219,CONCAT44(fVar264 * fVar216,fVar263 * fVar201)
                                    )));
    auVar144 = vsubps_avx(ZEXT1632(auVar100),auVar31);
    auVar32._4_4_ = fVar217 * fVar217;
    auVar32._0_4_ = fVar218 * fVar218;
    auVar32._8_4_ = fVar220 * fVar220;
    auVar32._12_4_ = fVar223 * fVar223;
    auVar32._16_4_ = fVar95 * fVar95;
    auVar32._20_4_ = fVar130 * fVar130;
    auVar32._24_4_ = fVar131 * fVar131;
    auVar32._28_4_ = auVar12._28_4_;
    auVar100 = vfmadd231ps_fma(auVar32,auVar116,auVar116);
    auVar100 = vfmadd231ps_fma(ZEXT1632(auVar100),auVar16,auVar16);
    auVar12 = vsubps_avx(ZEXT1632(auVar100),
                         ZEXT1632(CONCAT412(fVar222 * fVar222,
                                            CONCAT48(fVar219 * fVar219,
                                                     CONCAT44(fVar216 * fVar216,fVar201 * fVar201)))
                                 ));
    auVar112 = vsqrtps_avx(auVar111);
    fVar262 = auVar112._28_4_ + auVar173._28_4_;
    fVar201 = (auVar112._0_4_ + auVar173._0_4_) * 1.0000002;
    fVar216 = (auVar112._4_4_ + auVar173._4_4_) * 1.0000002;
    fVar219 = (auVar112._8_4_ + auVar173._8_4_) * 1.0000002;
    fVar222 = (auVar112._12_4_ + auVar173._12_4_) * 1.0000002;
    fVar179 = (auVar112._16_4_ + auVar173._16_4_) * 1.0000002;
    fVar257 = (auVar112._20_4_ + auVar173._20_4_) * 1.0000002;
    fVar261 = (auVar112._24_4_ + auVar173._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar216 * fVar216;
    auVar33._0_4_ = fVar201 * fVar201;
    auVar33._8_4_ = fVar219 * fVar219;
    auVar33._12_4_ = fVar222 * fVar222;
    auVar33._16_4_ = fVar179 * fVar179;
    auVar33._20_4_ = fVar257 * fVar257;
    auVar33._24_4_ = fVar261 * fVar261;
    auVar33._28_4_ = fVar262;
    local_a20._0_4_ = auVar144._0_4_ + auVar144._0_4_;
    local_a20._4_4_ = auVar144._4_4_ + auVar144._4_4_;
    local_a20._8_4_ = auVar144._8_4_ + auVar144._8_4_;
    local_a20._12_4_ = auVar144._12_4_ + auVar144._12_4_;
    local_a20._16_4_ = auVar144._16_4_ + auVar144._16_4_;
    local_a20._20_4_ = auVar144._20_4_ + auVar144._20_4_;
    local_a20._24_4_ = auVar144._24_4_ + auVar144._24_4_;
    fVar201 = auVar144._28_4_;
    local_a20._28_4_ = fVar201 + fVar201;
    auVar173 = vsubps_avx(auVar12,auVar33);
    auVar276 = ZEXT1632(auVar154);
    local_2c0._28_4_ = 0x3f800002;
    local_2c0._0_28_ =
         ZEXT1628(CONCAT412(fVar266 * fVar266,
                            CONCAT48(fVar265 * fVar265,CONCAT44(fVar264 * fVar264,fVar263 * fVar263)
                                    )));
    local_8e0 = vsubps_avx(local_280,local_2c0);
    auVar260 = ZEXT3264(local_8e0);
    auVar34._4_4_ = local_a20._4_4_ * local_a20._4_4_;
    auVar34._0_4_ = (float)local_a20._0_4_ * (float)local_a20._0_4_;
    auVar34._8_4_ = local_a20._8_4_ * local_a20._8_4_;
    auVar34._12_4_ = local_a20._12_4_ * local_a20._12_4_;
    auVar34._16_4_ = local_a20._16_4_ * local_a20._16_4_;
    auVar34._20_4_ = local_a20._20_4_ * local_a20._20_4_;
    auVar34._24_4_ = local_a20._24_4_ * local_a20._24_4_;
    auVar34._28_4_ = fVar262;
    fVar216 = local_8e0._0_4_;
    fVar219 = local_8e0._4_4_;
    fVar222 = local_8e0._8_4_;
    fVar179 = local_8e0._12_4_;
    fVar257 = local_8e0._16_4_;
    fVar261 = local_8e0._20_4_;
    fVar262 = local_8e0._24_4_;
    auVar35._4_4_ = fVar219 * 4.0 * auVar173._4_4_;
    auVar35._0_4_ = fVar216 * 4.0 * auVar173._0_4_;
    auVar35._8_4_ = fVar222 * 4.0 * auVar173._8_4_;
    auVar35._12_4_ = fVar179 * 4.0 * auVar173._12_4_;
    auVar35._16_4_ = fVar257 * 4.0 * auVar173._16_4_;
    auVar35._20_4_ = fVar261 * 4.0 * auVar173._20_4_;
    auVar35._24_4_ = fVar262 * 4.0 * auVar173._24_4_;
    auVar35._28_4_ = fVar201;
    auVar144 = vsubps_avx(auVar34,auVar35);
    auVar111 = vcmpps_avx(auVar144,auVar117,5);
    auVar296 = ZEXT1632(auVar105);
    fVar201 = local_8e0._28_4_;
    if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar111 >> 0x7f,0) == '\0') &&
          (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar111 >> 0xbf,0) == '\0') &&
        (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar111[0x1f])
    {
      auVar244 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar195._8_4_ = 0xff800000;
      auVar195._0_8_ = 0xff800000ff800000;
      auVar195._12_4_ = 0xff800000;
      auVar195._16_4_ = 0xff800000;
      auVar195._20_4_ = 0xff800000;
      auVar195._24_4_ = 0xff800000;
      auVar195._28_4_ = 0xff800000;
    }
    else {
      auVar13 = vsqrtps_avx(auVar144);
      auVar287._0_4_ = fVar216 + fVar216;
      auVar287._4_4_ = fVar219 + fVar219;
      auVar287._8_4_ = fVar222 + fVar222;
      auVar287._12_4_ = fVar179 + fVar179;
      auVar287._16_4_ = fVar257 + fVar257;
      auVar287._20_4_ = fVar261 + fVar261;
      auVar287._24_4_ = fVar262 + fVar262;
      auVar287._28_4_ = fVar201 + fVar201;
      auVar11 = vrcpps_avx(auVar287);
      auVar117 = vcmpps_avx(auVar144,auVar117,5);
      auVar118._8_4_ = 0x3f800000;
      auVar118._0_8_ = 0x3f8000003f800000;
      auVar118._12_4_ = 0x3f800000;
      auVar118._16_4_ = 0x3f800000;
      auVar118._20_4_ = 0x3f800000;
      auVar118._24_4_ = 0x3f800000;
      auVar118._28_4_ = 0x3f800000;
      auVar154 = vfnmadd213ps_fma(auVar287,auVar11,auVar118);
      auVar154 = vfmadd132ps_fma(ZEXT1632(auVar154),auVar11,auVar11);
      auVar196._0_4_ = local_a20._0_4_ ^ local_800;
      auVar196._4_4_ = (uint)local_a20._4_4_ ^ uStack_7fc;
      auVar196._8_4_ = (uint)local_a20._8_4_ ^ uStack_7f8;
      auVar196._12_4_ = (uint)local_a20._12_4_ ^ uStack_7f4;
      auVar196._16_4_ = (uint)local_a20._16_4_ ^ (uint)fStack_7f0;
      auVar196._20_4_ = (uint)local_a20._20_4_ ^ (uint)fStack_7ec;
      auVar196._24_4_ = (uint)local_a20._24_4_ ^ (uint)fStack_7e8;
      auVar196._28_4_ = (uint)local_a20._28_4_ ^ uStack_7e4;
      auVar144 = vsubps_avx(auVar196,auVar13);
      auVar36._4_4_ = auVar154._4_4_ * auVar144._4_4_;
      auVar36._0_4_ = auVar154._0_4_ * auVar144._0_4_;
      auVar36._8_4_ = auVar154._8_4_ * auVar144._8_4_;
      auVar36._12_4_ = auVar154._12_4_ * auVar144._12_4_;
      auVar36._16_4_ = auVar144._16_4_ * 0.0;
      auVar36._20_4_ = auVar144._20_4_ * 0.0;
      auVar36._24_4_ = auVar144._24_4_ * 0.0;
      auVar36._28_4_ = auVar144._28_4_;
      auVar144 = vsubps_avx(auVar13,local_a20);
      auVar37._4_4_ = auVar154._4_4_ * auVar144._4_4_;
      auVar37._0_4_ = auVar154._0_4_ * auVar144._0_4_;
      auVar37._8_4_ = auVar154._8_4_ * auVar144._8_4_;
      auVar37._12_4_ = auVar154._12_4_ * auVar144._12_4_;
      auVar37._16_4_ = auVar144._16_4_ * 0.0;
      auVar37._20_4_ = auVar144._20_4_ * 0.0;
      auVar37._24_4_ = auVar144._24_4_ * 0.0;
      auVar37._28_4_ = auVar144._28_4_;
      auVar154 = vfmadd213ps_fma(auVar276,auVar36,auVar296);
      local_300 = auVar154._0_4_ * fVar215;
      fStack_2fc = auVar154._4_4_ * fVar221;
      fStack_2f8 = auVar154._8_4_ * fVar256;
      fStack_2f4 = auVar154._12_4_ * fVar273;
      uStack_2f0 = 0;
      uStack_2ec = 0;
      uStack_2e8 = 0;
      uStack_2e4 = 0x3f800000;
      auVar57._4_4_ = uStack_8fc;
      auVar57._0_4_ = local_900;
      auVar57._8_4_ = uStack_8f8;
      auVar57._12_4_ = uStack_8f4;
      auVar57._16_4_ = uStack_8f0;
      auVar57._20_4_ = uStack_8ec;
      auVar57._24_4_ = uStack_8e8;
      auVar57._28_4_ = uStack_8e4;
      auVar144 = vandps_avx(local_2c0,auVar57);
      auVar144 = vmaxps_avx(local_640,auVar144);
      auVar38._4_4_ = auVar144._4_4_ * 1.9073486e-06;
      auVar38._0_4_ = auVar144._0_4_ * 1.9073486e-06;
      auVar38._8_4_ = auVar144._8_4_ * 1.9073486e-06;
      auVar38._12_4_ = auVar144._12_4_ * 1.9073486e-06;
      auVar38._16_4_ = auVar144._16_4_ * 1.9073486e-06;
      auVar38._20_4_ = auVar144._20_4_ * 1.9073486e-06;
      auVar38._24_4_ = auVar144._24_4_ * 1.9073486e-06;
      auVar38._28_4_ = auVar144._28_4_;
      auVar144 = vandps_avx(local_8e0,auVar57);
      auVar11 = vcmpps_avx(auVar144,auVar38,1);
      auVar154 = vfmadd213ps_fma(auVar276,auVar37,auVar296);
      auVar119._8_4_ = 0x7f800000;
      auVar119._0_8_ = 0x7f8000007f800000;
      auVar119._12_4_ = 0x7f800000;
      auVar119._16_4_ = 0x7f800000;
      auVar119._20_4_ = 0x7f800000;
      auVar119._24_4_ = 0x7f800000;
      auVar119._28_4_ = 0x7f800000;
      auVar144 = vblendvps_avx(auVar119,auVar36,auVar117);
      local_320 = auVar154._0_4_ * fVar215;
      fStack_31c = auVar154._4_4_ * fVar221;
      fStack_318 = auVar154._8_4_ * fVar256;
      fStack_314 = auVar154._12_4_ * fVar273;
      uStack_310 = 0;
      uStack_30c = 0;
      uStack_308 = 0;
      uStack_304 = auVar144._28_4_;
      auVar120._8_4_ = 0xff800000;
      auVar120._0_8_ = 0xff800000ff800000;
      auVar120._12_4_ = 0xff800000;
      auVar120._16_4_ = 0xff800000;
      auVar120._20_4_ = 0xff800000;
      auVar120._24_4_ = 0xff800000;
      auVar120._28_4_ = 0xff800000;
      auVar195 = vblendvps_avx(auVar120,auVar37,auVar117);
      auVar13 = auVar117 & auVar11;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar13 >> 0x7f,0) == '\0') &&
            (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0xbf,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f])
      {
        auVar244 = ZEXT3264(auVar144);
      }
      else {
        auVar111 = vandps_avx(auVar11,auVar117);
        auVar11 = vcmpps_avx(auVar173,_DAT_01faff00,2);
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
        auVar151._8_4_ = 0x7f800000;
        auVar151._0_8_ = 0x7f8000007f800000;
        auVar151._12_4_ = 0x7f800000;
        auVar151._16_4_ = 0x7f800000;
        auVar151._20_4_ = 0x7f800000;
        auVar151._24_4_ = 0x7f800000;
        auVar151._28_4_ = 0x7f800000;
        auVar173 = vblendvps_avx(auVar151,auVar128,auVar11);
        auVar154 = vpackssdw_avx(auVar111._0_16_,auVar111._16_16_);
        auVar13 = vpmovsxwd_avx2(auVar154);
        auVar173 = vblendvps_avx(auVar144,auVar173,auVar13);
        auVar144 = vblendvps_avx(auVar128,auVar151,auVar11);
        auVar195 = vblendvps_avx(auVar195,auVar144,auVar13);
        auVar214._0_8_ = auVar111._0_8_ ^ 0xffffffffffffffff;
        auVar214._8_4_ = auVar111._8_4_ ^ 0xffffffff;
        auVar214._12_4_ = auVar111._12_4_ ^ 0xffffffff;
        auVar214._16_4_ = auVar111._16_4_ ^ 0xffffffff;
        auVar214._20_4_ = auVar111._20_4_ ^ 0xffffffff;
        auVar214._24_4_ = auVar111._24_4_ ^ 0xffffffff;
        auVar214._28_4_ = auVar111._28_4_ ^ 0xffffffff;
        auVar111 = vorps_avx(auVar11,auVar214);
        auVar244 = ZEXT3264(auVar173);
        auVar111 = vandps_avx(auVar117,auVar111);
      }
    }
    auVar173 = local_7e0 & auVar111;
    if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar173 >> 0x7f,0) != '\0') ||
          (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar173 >> 0xbf,0) != '\0') ||
        (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar173[0x1f] < '\0') {
      local_340 = ZEXT1632(auVar9);
      fVar263 = *(float *)(ray + k * 4 + 0x100);
      local_6d0 = ZEXT416((uint)fVar263);
      fVar264 = fVar263 - (float)local_970._0_4_;
      auVar212._4_4_ = fVar264;
      auVar212._0_4_ = fVar264;
      auVar212._8_4_ = fVar264;
      auVar212._12_4_ = fVar264;
      auVar212._16_4_ = fVar264;
      auVar212._20_4_ = fVar264;
      auVar212._24_4_ = fVar264;
      auVar212._28_4_ = fVar264;
      auVar117 = vminps_avx(auVar212,auVar195);
      auVar39._4_4_ = fVar133 * fVar217;
      auVar39._0_4_ = fVar132 * fVar218;
      auVar39._8_4_ = fVar134 * fVar220;
      auVar39._12_4_ = fVar135 * fVar223;
      auVar39._16_4_ = fVar153 * fVar95;
      auVar39._20_4_ = fVar177 * fVar130;
      auVar39._24_4_ = fVar178 * fVar131;
      auVar39._28_4_ = fVar264;
      auVar9 = vfmadd213ps_fma(auVar116,auVar241,auVar39);
      auVar75._4_4_ = fStack_2dc;
      auVar75._0_4_ = local_2e0;
      auVar75._8_4_ = fStack_2d8;
      auVar75._12_4_ = fStack_2d4;
      auVar75._16_4_ = fStack_2d0;
      auVar75._20_4_ = fStack_2cc;
      auVar75._24_4_ = fStack_2c8;
      auVar75._28_4_ = fStack_2c4;
      auVar144 = vmaxps_avx(auVar75,auVar244._0_32_);
      auVar154 = vfmadd213ps_fma(auVar16,local_a80,ZEXT1632(auVar9));
      auVar271._0_4_ = fVar132 * (float)local_aa0._0_4_;
      auVar271._4_4_ = fVar133 * (float)local_aa0._4_4_;
      auVar271._8_4_ = fVar134 * fStack_a98;
      auVar271._12_4_ = fVar135 * fStack_a94;
      auVar271._16_4_ = fVar153 * fStack_a90;
      auVar271._20_4_ = fVar177 * fStack_a8c;
      auVar271._28_36_ = auVar244._28_36_;
      auVar271._24_4_ = fVar178 * fStack_a88;
      auVar260 = ZEXT3264(_local_b20);
      auVar9 = vfmadd231ps_fma(auVar271._0_32_,_local_b20,auVar241);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_8a0,local_a80);
      auVar58._4_4_ = uStack_8fc;
      auVar58._0_4_ = local_900;
      auVar58._8_4_ = uStack_8f8;
      auVar58._12_4_ = uStack_8f4;
      auVar58._16_4_ = uStack_8f0;
      auVar58._20_4_ = uStack_8ec;
      auVar58._24_4_ = uStack_8e8;
      auVar58._28_4_ = uStack_8e4;
      auVar173 = vandps_avx(auVar58,ZEXT1632(auVar105));
      auVar142._8_4_ = 0x219392ef;
      auVar142._0_8_ = 0x219392ef219392ef;
      auVar142._12_4_ = 0x219392ef;
      auVar142._16_4_ = 0x219392ef;
      auVar142._20_4_ = 0x219392ef;
      auVar142._24_4_ = 0x219392ef;
      auVar142._28_4_ = 0x219392ef;
      auVar116 = vcmpps_avx(auVar173,auVar142,1);
      auVar173 = vrcpps_avx(ZEXT1632(auVar105));
      auVar288._8_4_ = 0x3f800000;
      auVar288._0_8_ = 0x3f8000003f800000;
      auVar288._12_4_ = 0x3f800000;
      auVar288._16_4_ = 0x3f800000;
      auVar288._20_4_ = 0x3f800000;
      auVar288._24_4_ = 0x3f800000;
      auVar288._28_4_ = 0x3f800000;
      auVar241 = ZEXT1632(auVar105);
      auVar9 = vfnmadd213ps_fma(auVar173,auVar241,auVar288);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar173,auVar173);
      auVar289._0_4_ = auVar105._0_4_ ^ local_800;
      auVar289._4_4_ = auVar105._4_4_ ^ uStack_7fc;
      auVar289._8_4_ = auVar105._8_4_ ^ uStack_7f8;
      auVar289._12_4_ = auVar105._12_4_ ^ uStack_7f4;
      auVar289._16_4_ = fStack_7f0;
      auVar289._20_4_ = fStack_7ec;
      auVar289._24_4_ = fStack_7e8;
      auVar289._28_4_ = uStack_7e4;
      auVar40._4_4_ = auVar9._4_4_ * (float)(auVar154._4_4_ ^ uStack_7fc);
      auVar40._0_4_ = auVar9._0_4_ * (float)(auVar154._0_4_ ^ local_800);
      auVar40._8_4_ = auVar9._8_4_ * (float)(auVar154._8_4_ ^ uStack_7f8);
      auVar40._12_4_ = auVar9._12_4_ * (float)(auVar154._12_4_ ^ uStack_7f4);
      auVar40._16_4_ = fStack_7f0 * 0.0;
      auVar40._20_4_ = fStack_7ec * 0.0;
      auVar40._24_4_ = fStack_7e8 * 0.0;
      auVar40._28_4_ = uStack_7e4;
      auVar173 = vcmpps_avx(auVar241,auVar289,1);
      auVar173 = vorps_avx(auVar116,auVar173);
      auVar279._8_4_ = 0xff800000;
      auVar279._0_8_ = 0xff800000ff800000;
      auVar279._12_4_ = 0xff800000;
      auVar279._16_4_ = 0xff800000;
      auVar279._20_4_ = 0xff800000;
      auVar279._24_4_ = 0xff800000;
      auVar279._28_4_ = 0xff800000;
      auVar173 = vblendvps_avx(auVar40,auVar279,auVar173);
      auVar16 = vmaxps_avx(auVar144,auVar173);
      auVar173 = vcmpps_avx(auVar241,auVar289,6);
      auVar173 = vorps_avx(auVar116,auVar173);
      auVar290._8_4_ = 0x7f800000;
      auVar290._0_8_ = 0x7f8000007f800000;
      auVar290._12_4_ = 0x7f800000;
      auVar290._16_4_ = 0x7f800000;
      auVar290._20_4_ = 0x7f800000;
      auVar290._24_4_ = 0x7f800000;
      auVar290._28_4_ = 0x7f800000;
      auVar173 = vblendvps_avx(auVar40,auVar290,auVar173);
      auVar144 = vminps_avx(auVar117,auVar173);
      fVar218 = (float)(local_800 ^ (uint)local_ae0._0_4_);
      fVar217 = (float)(uStack_7fc ^ (uint)local_ae0._4_4_);
      fVar220 = (float)(uStack_7f8 ^ (uint)local_ae0._8_4_);
      fVar223 = (float)(uStack_7f4 ^ (uint)local_ae0._12_4_);
      fVar95 = (float)((uint)fStack_7f0 ^ (uint)local_ae0._16_4_);
      fVar130 = (float)((uint)fStack_7ec ^ (uint)local_ae0._20_4_);
      fVar131 = (float)((uint)fStack_7e8 ^ (uint)local_ae0._24_4_);
      auVar242._0_4_ = local_800 ^ (uint)local_9e0._0_4_;
      auVar242._4_4_ = uStack_7fc ^ (uint)local_9e0._4_4_;
      auVar242._8_4_ = uStack_7f8 ^ (uint)local_9e0._8_4_;
      auVar242._12_4_ = uStack_7f4 ^ (uint)local_9e0._12_4_;
      auVar242._16_4_ = (uint)fStack_7f0 ^ (uint)local_9e0._16_4_;
      auVar242._20_4_ = (uint)fStack_7ec ^ (uint)local_9e0._20_4_;
      auVar242._24_4_ = (uint)fStack_7e8 ^ (uint)local_9e0._24_4_;
      auVar242._28_4_ = uStack_7e4 ^ local_9e0._28_4_;
      auVar173 = vsubps_avx(ZEXT832(0) << 0x20,local_840);
      auVar116 = vsubps_avx(ZEXT832(0) << 0x20,auVar213);
      auVar41._4_4_ = auVar116._4_4_ * fVar217;
      auVar41._0_4_ = auVar116._0_4_ * fVar218;
      auVar41._8_4_ = auVar116._8_4_ * fVar220;
      auVar41._12_4_ = auVar116._12_4_ * fVar223;
      auVar41._16_4_ = auVar116._16_4_ * fVar95;
      auVar41._20_4_ = auVar116._20_4_ * fVar130;
      auVar41._24_4_ = auVar116._24_4_ * fVar131;
      auVar41._28_4_ = auVar116._28_4_;
      auVar9 = vfmadd231ps_fma(auVar41,auVar242,auVar173);
      local_b00._28_4_ = auVar18._28_4_;
      auVar249._0_4_ = local_800 ^ (uint)auVar18._0_4_;
      auVar249._4_4_ = uStack_7fc ^ (uint)auVar18._4_4_;
      auVar249._8_4_ = uStack_7f8 ^ (uint)auVar18._8_4_;
      auVar249._12_4_ = uStack_7f4 ^ (uint)auVar18._12_4_;
      auVar249._16_4_ = (uint)fStack_7f0 ^ (uint)auVar18._16_4_;
      auVar249._20_4_ = (uint)fStack_7ec ^ (uint)auVar18._20_4_;
      auVar249._24_4_ = (uint)fStack_7e8 ^ (uint)auVar18._24_4_;
      auVar249._28_4_ = uStack_7e4 ^ local_b00._28_4_;
      auVar173 = vsubps_avx(ZEXT832(0) << 0x20,auVar17);
      auVar154 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar249,auVar173);
      auVar42._4_4_ = fVar217 * (float)local_aa0._4_4_;
      auVar42._0_4_ = fVar218 * (float)local_aa0._0_4_;
      auVar42._8_4_ = fVar220 * fStack_a98;
      auVar42._12_4_ = fVar223 * fStack_a94;
      auVar42._16_4_ = fVar95 * fStack_a90;
      auVar42._20_4_ = fVar130 * fStack_a8c;
      auVar42._24_4_ = fVar131 * fStack_a88;
      auVar42._28_4_ = uStack_7e4 ^ local_ae0._28_4_;
      auVar9 = vfmadd231ps_fma(auVar42,_local_b20,auVar242);
      auVar105 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_8a0,auVar249);
      auVar173 = vandps_avx(auVar58,ZEXT1632(auVar105));
      auVar295._8_4_ = 0x3f800000;
      auVar295._0_8_ = 0x3f8000003f800000;
      auVar295._12_4_ = 0x3f800000;
      auVar295._16_4_ = 0x3f800000;
      auVar295._20_4_ = 0x3f800000;
      auVar295._24_4_ = 0x3f800000;
      auVar295._28_4_ = 0x3f800000;
      auVar17 = vrcpps_avx(ZEXT1632(auVar105));
      auVar197._8_4_ = 0x219392ef;
      auVar197._0_8_ = 0x219392ef219392ef;
      auVar197._12_4_ = 0x219392ef;
      auVar197._16_4_ = 0x219392ef;
      auVar197._20_4_ = 0x219392ef;
      auVar197._24_4_ = 0x219392ef;
      auVar197._28_4_ = 0x219392ef;
      auVar116 = vcmpps_avx(auVar173,auVar197,1);
      auVar244 = ZEXT3264(auVar116);
      auVar213 = ZEXT1632(auVar105);
      auVar9 = vfnmadd213ps_fma(auVar17,auVar213,auVar295);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar17,auVar17);
      auVar250._0_4_ = auVar105._0_4_ ^ local_800;
      auVar250._4_4_ = auVar105._4_4_ ^ uStack_7fc;
      auVar250._8_4_ = auVar105._8_4_ ^ uStack_7f8;
      auVar250._12_4_ = auVar105._12_4_ ^ uStack_7f4;
      auVar250._16_4_ = fStack_7f0;
      auVar250._20_4_ = fStack_7ec;
      auVar250._24_4_ = fStack_7e8;
      auVar250._28_4_ = uStack_7e4;
      auVar43._4_4_ = auVar9._4_4_ * (float)(auVar154._4_4_ ^ uStack_7fc);
      auVar43._0_4_ = auVar9._0_4_ * (float)(auVar154._0_4_ ^ local_800);
      auVar43._8_4_ = auVar9._8_4_ * (float)(auVar154._8_4_ ^ uStack_7f8);
      auVar43._12_4_ = auVar9._12_4_ * (float)(auVar154._12_4_ ^ uStack_7f4);
      auVar43._16_4_ = fStack_7f0 * 0.0;
      auVar43._20_4_ = fStack_7ec * 0.0;
      auVar43._24_4_ = fStack_7e8 * 0.0;
      auVar43._28_4_ = uStack_7e4;
      auVar271 = ZEXT3264(auVar43);
      auVar173 = vcmpps_avx(auVar213,auVar250,1);
      auVar173 = vorps_avx(auVar173,auVar116);
      auVar143._8_4_ = 0xff800000;
      auVar143._0_8_ = 0xff800000ff800000;
      auVar143._12_4_ = 0xff800000;
      auVar143._16_4_ = 0xff800000;
      auVar143._20_4_ = 0xff800000;
      auVar143._24_4_ = 0xff800000;
      auVar143._28_4_ = 0xff800000;
      auVar173 = vblendvps_avx(auVar43,auVar143,auVar173);
      auVar282 = ZEXT3264(auVar173);
      _local_a40 = vmaxps_avx(auVar16,auVar173);
      auVar173 = vcmpps_avx(auVar213,auVar250,6);
      auVar173 = vorps_avx(auVar116,auVar173);
      auVar198._8_4_ = 0x7f800000;
      auVar198._0_8_ = 0x7f8000007f800000;
      auVar198._12_4_ = 0x7f800000;
      auVar198._16_4_ = 0x7f800000;
      auVar198._20_4_ = 0x7f800000;
      auVar198._24_4_ = 0x7f800000;
      auVar198._28_4_ = 0x7f800000;
      auVar173 = vblendvps_avx(auVar43,auVar198,auVar173);
      auVar111 = vandps_avx(local_7e0,auVar111);
      local_360 = vminps_avx(auVar144,auVar173);
      auVar173 = vcmpps_avx(_local_a40,local_360,2);
      auVar116 = auVar111 & auVar173;
      if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar116 >> 0x7f,0) != '\0') ||
            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar116 >> 0xbf,0) != '\0') ||
          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar116[0x1f] < '\0') {
        auVar74._4_4_ = fStack_2fc;
        auVar74._0_4_ = local_300;
        auVar74._8_4_ = fStack_2f8;
        auVar74._12_4_ = fStack_2f4;
        auVar74._16_4_ = uStack_2f0;
        auVar74._20_4_ = uStack_2ec;
        auVar74._24_4_ = uStack_2e8;
        auVar74._28_4_ = uStack_2e4;
        auVar116 = vminps_avx(auVar74,auVar295);
        auVar282 = ZEXT864(0) << 0x20;
        auVar116 = vmaxps_avx(auVar116,ZEXT832(0) << 0x20);
        auVar73._4_4_ = fStack_31c;
        auVar73._0_4_ = local_320;
        auVar73._8_4_ = fStack_318;
        auVar73._12_4_ = fStack_314;
        auVar73._16_4_ = uStack_310;
        auVar73._20_4_ = uStack_30c;
        auVar73._24_4_ = uStack_308;
        auVar73._28_4_ = uStack_304;
        auVar16 = vminps_avx(auVar73,auVar295);
        auVar16 = vmaxps_avx(auVar16,ZEXT832(0) << 0x20);
        auVar44._4_4_ = (auVar116._4_4_ + 1.0) * 0.125;
        auVar44._0_4_ = (auVar116._0_4_ + 0.0) * 0.125;
        auVar44._8_4_ = (auVar116._8_4_ + 2.0) * 0.125;
        auVar44._12_4_ = (auVar116._12_4_ + 3.0) * 0.125;
        auVar44._16_4_ = (auVar116._16_4_ + 4.0) * 0.125;
        auVar44._20_4_ = (auVar116._20_4_ + 5.0) * 0.125;
        auVar44._24_4_ = (auVar116._24_4_ + 6.0) * 0.125;
        auVar44._28_4_ = auVar116._28_4_ + 7.0;
        auVar9 = vfmadd213ps_fma(auVar44,local_880,local_860);
        auVar45._4_4_ = (auVar16._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar16._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar16._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar16._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar16._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar16._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar16._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar16._28_4_ + 7.0;
        auVar154 = vfmadd213ps_fma(auVar45,local_880,local_860);
        auVar144 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar116 = vminps_avx(auVar294,auVar233);
        auVar16 = vminps_avx(auVar19,auVar20);
        auVar116 = vminps_avx(auVar116,auVar16);
        auVar112 = vsubps_avx(auVar116,auVar112);
        auVar111 = vandps_avx(auVar173,auVar111);
        local_1a0 = ZEXT1632(auVar9);
        local_1c0 = ZEXT1632(auVar154);
        auVar46._4_4_ = auVar112._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar112._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar112._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar112._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar112._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar112._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar112._24_4_ * 0.99999976;
        auVar46._28_4_ = auVar112._28_4_;
        auVar173 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar46);
        auVar47._4_4_ = auVar173._4_4_ * auVar173._4_4_;
        auVar47._0_4_ = auVar173._0_4_ * auVar173._0_4_;
        auVar47._8_4_ = auVar173._8_4_ * auVar173._8_4_;
        auVar47._12_4_ = auVar173._12_4_ * auVar173._12_4_;
        auVar47._16_4_ = auVar173._16_4_ * auVar173._16_4_;
        auVar47._20_4_ = auVar173._20_4_ * auVar173._20_4_;
        auVar47._24_4_ = auVar173._24_4_ * auVar173._24_4_;
        auVar47._28_4_ = auVar173._28_4_;
        auVar112 = vsubps_avx(auVar12,auVar47);
        auVar48._4_4_ = fVar219 * 4.0 * auVar112._4_4_;
        auVar48._0_4_ = fVar216 * 4.0 * auVar112._0_4_;
        auVar48._8_4_ = fVar222 * 4.0 * auVar112._8_4_;
        auVar48._12_4_ = fVar179 * 4.0 * auVar112._12_4_;
        auVar48._16_4_ = fVar257 * 4.0 * auVar112._16_4_;
        auVar48._20_4_ = fVar261 * 4.0 * auVar112._20_4_;
        auVar48._24_4_ = fVar262 * 4.0 * auVar112._24_4_;
        auVar48._28_4_ = auVar173._28_4_;
        auVar12 = vsubps_avx(auVar34,auVar48);
        auVar271 = ZEXT3264(auVar12);
        auVar173 = vcmpps_avx(auVar12,ZEXT832(0) << 0x20,5);
        if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar173 >> 0x7f,0) == '\0') &&
              (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar173 >> 0xbf,0) == '\0') &&
            (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar173[0x1f]) {
          auVar121 = SUB6432(ZEXT864(0),0) << 0x20;
          local_940 = ZEXT832(0) << 0x20;
          _local_820 = ZEXT832(0) << 0x20;
          auVar175 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar243._8_4_ = 0x7f800000;
          auVar243._0_8_ = 0x7f8000007f800000;
          auVar243._12_4_ = 0x7f800000;
          auVar243._16_4_ = 0x7f800000;
          auVar243._20_4_ = 0x7f800000;
          auVar243._24_4_ = 0x7f800000;
          auVar243._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
          local_920 = local_940;
        }
        else {
          auVar16 = vsqrtps_avx(auVar12);
          auVar252._0_4_ = fVar216 + fVar216;
          auVar252._4_4_ = fVar219 + fVar219;
          auVar252._8_4_ = fVar222 + fVar222;
          auVar252._12_4_ = fVar179 + fVar179;
          auVar252._16_4_ = fVar257 + fVar257;
          auVar252._20_4_ = fVar261 + fVar261;
          auVar252._24_4_ = fVar262 + fVar262;
          auVar252._28_4_ = fVar201 + fVar201;
          auVar116 = vrcpps_avx(auVar252);
          auVar9 = vfnmadd213ps_fma(auVar252,auVar116,auVar295);
          auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar116,auVar116);
          auVar280._0_4_ = local_a20._0_4_ ^ local_800;
          auVar280._4_4_ = (uint)local_a20._4_4_ ^ uStack_7fc;
          auVar280._8_4_ = (uint)local_a20._8_4_ ^ uStack_7f8;
          auVar280._12_4_ = (uint)local_a20._12_4_ ^ uStack_7f4;
          auVar280._16_4_ = (uint)local_a20._16_4_ ^ (uint)fStack_7f0;
          auVar280._20_4_ = (uint)local_a20._20_4_ ^ (uint)fStack_7ec;
          auVar280._24_4_ = (uint)local_a20._24_4_ ^ (uint)fStack_7e8;
          auVar280._28_4_ = (uint)local_a20._28_4_ ^ uStack_7e4;
          auVar116 = vsubps_avx(auVar280,auVar16);
          auVar144 = vsubps_avx(auVar16,local_a20);
          fVar218 = auVar116._0_4_ * auVar9._0_4_;
          fVar217 = auVar116._4_4_ * auVar9._4_4_;
          auVar49._4_4_ = fVar217;
          auVar49._0_4_ = fVar218;
          fVar216 = auVar116._8_4_ * auVar9._8_4_;
          auVar49._8_4_ = fVar216;
          fVar220 = auVar116._12_4_ * auVar9._12_4_;
          auVar49._12_4_ = fVar220;
          fVar219 = auVar116._16_4_ * 0.0;
          auVar49._16_4_ = fVar219;
          fVar223 = auVar116._20_4_ * 0.0;
          auVar49._20_4_ = fVar223;
          fVar222 = auVar116._24_4_ * 0.0;
          auVar49._24_4_ = fVar222;
          auVar49._28_4_ = auVar16._28_4_;
          fVar95 = auVar9._0_4_ * auVar144._0_4_;
          fVar130 = auVar9._4_4_ * auVar144._4_4_;
          auVar50._4_4_ = fVar130;
          auVar50._0_4_ = fVar95;
          fVar131 = auVar9._8_4_ * auVar144._8_4_;
          auVar50._8_4_ = fVar131;
          fVar132 = auVar9._12_4_ * auVar144._12_4_;
          auVar50._12_4_ = fVar132;
          fVar133 = auVar144._16_4_ * 0.0;
          auVar50._16_4_ = fVar133;
          fVar134 = auVar144._20_4_ * 0.0;
          auVar50._20_4_ = fVar134;
          fVar135 = auVar144._24_4_ * 0.0;
          auVar50._24_4_ = fVar135;
          auVar50._28_4_ = auVar116._28_4_;
          auVar282 = ZEXT3264(auVar50);
          auVar9 = vfmadd213ps_fma(auVar276,auVar49,auVar296);
          auVar154 = vfmadd213ps_fma(auVar276,auVar50,auVar296);
          auVar116 = ZEXT1632(CONCAT412(auVar9._12_4_ * fVar273,
                                        CONCAT48(auVar9._8_4_ * fVar256,
                                                 CONCAT44(auVar9._4_4_ * fVar221,
                                                          auVar9._0_4_ * fVar215))));
          auVar51._28_4_ = local_b20._28_4_;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(auVar154._12_4_ * fVar273,
                                  CONCAT48(auVar154._8_4_ * fVar256,
                                           CONCAT44(auVar154._4_4_ * fVar221,
                                                    auVar154._0_4_ * fVar215))));
          auVar9 = vfmadd213ps_fma(auVar14,auVar116,auVar114);
          auVar154 = vfmadd213ps_fma(auVar14,auVar51,auVar114);
          auVar105 = vfmadd213ps_fma(auVar15,auVar116,local_a00);
          auVar100 = vfmadd213ps_fma(auVar15,auVar51,local_a00);
          auVar137 = vfmadd213ps_fma(auVar116,auVar121,auVar167);
          auVar164 = vfmadd213ps_fma(auVar121,auVar51,auVar167);
          auVar52._4_4_ = (float)local_8a0._4_4_ * fVar217;
          auVar52._0_4_ = (float)local_8a0._0_4_ * fVar218;
          auVar52._8_4_ = fStack_898 * fVar216;
          auVar52._12_4_ = fStack_894 * fVar220;
          auVar52._16_4_ = fStack_890 * fVar219;
          auVar52._20_4_ = fStack_88c * fVar223;
          auVar52._24_4_ = fStack_888 * fVar222;
          auVar52._28_4_ = 0;
          auVar121 = vsubps_avx(auVar52,ZEXT1632(auVar9));
          auVar53._4_4_ = (float)local_b20._4_4_ * fVar217;
          auVar53._0_4_ = (float)local_b20._0_4_ * fVar218;
          auVar53._8_4_ = fStack_b18 * fVar216;
          auVar53._12_4_ = fStack_b14 * fVar220;
          auVar53._16_4_ = fStack_b10 * fVar219;
          auVar53._20_4_ = fStack_b0c * fVar223;
          auVar53._24_4_ = fStack_b08 * fVar222;
          auVar53._28_4_ = fVar201;
          auVar144 = vsubps_avx(auVar53,ZEXT1632(auVar105));
          auVar168._0_4_ = (float)local_aa0._0_4_ * fVar218;
          auVar168._4_4_ = (float)local_aa0._4_4_ * fVar217;
          auVar168._8_4_ = fStack_a98 * fVar216;
          auVar168._12_4_ = fStack_a94 * fVar220;
          auVar168._16_4_ = fStack_a90 * fVar219;
          auVar168._20_4_ = fStack_a8c * fVar223;
          auVar168._24_4_ = fStack_a88 * fVar222;
          auVar168._28_4_ = 0;
          auVar14 = vsubps_avx(auVar168,ZEXT1632(auVar137));
          auVar175 = ZEXT3264(auVar14);
          auVar253._0_4_ = (float)local_8a0._0_4_ * fVar95;
          auVar253._4_4_ = (float)local_8a0._4_4_ * fVar130;
          auVar253._8_4_ = fStack_898 * fVar131;
          auVar253._12_4_ = fStack_894 * fVar132;
          auVar253._16_4_ = fStack_890 * fVar133;
          auVar253._20_4_ = fStack_88c * fVar134;
          auVar253._24_4_ = fStack_888 * fVar135;
          auVar253._28_4_ = 0;
          local_920 = vsubps_avx(auVar253,ZEXT1632(auVar154));
          auVar54._4_4_ = (float)local_b20._4_4_ * fVar130;
          auVar54._0_4_ = (float)local_b20._0_4_ * fVar95;
          auVar54._8_4_ = fStack_b18 * fVar131;
          auVar54._12_4_ = fStack_b14 * fVar132;
          auVar54._16_4_ = fStack_b10 * fVar133;
          auVar54._20_4_ = fStack_b0c * fVar134;
          auVar54._24_4_ = fStack_b08 * fVar135;
          auVar54._28_4_ = local_920._28_4_;
          local_940 = vsubps_avx(auVar54,ZEXT1632(auVar100));
          auVar55._4_4_ = (float)local_aa0._4_4_ * fVar130;
          auVar55._0_4_ = (float)local_aa0._0_4_ * fVar95;
          auVar55._8_4_ = fStack_a98 * fVar131;
          auVar55._12_4_ = fStack_a94 * fVar132;
          auVar55._16_4_ = fStack_a90 * fVar133;
          auVar55._20_4_ = fStack_a8c * fVar134;
          auVar55._24_4_ = fStack_a88 * fVar135;
          auVar55._28_4_ = local_940._28_4_;
          _local_820 = vsubps_avx(auVar55,ZEXT1632(auVar164));
          auVar277 = ZEXT864(0) << 0x20;
          auVar14 = vcmpps_avx(auVar12,_DAT_01faff00,5);
          auVar254._8_4_ = 0x7f800000;
          auVar254._0_8_ = 0x7f8000007f800000;
          auVar254._12_4_ = 0x7f800000;
          auVar254._16_4_ = 0x7f800000;
          auVar254._20_4_ = 0x7f800000;
          auVar254._24_4_ = 0x7f800000;
          auVar254._28_4_ = 0x7f800000;
          auVar243 = vblendvps_avx(auVar254,auVar49,auVar14);
          auVar59._4_4_ = uStack_8fc;
          auVar59._0_4_ = local_900;
          auVar59._8_4_ = uStack_8f8;
          auVar59._12_4_ = uStack_8f4;
          auVar59._16_4_ = uStack_8f0;
          auVar59._20_4_ = uStack_8ec;
          auVar59._24_4_ = uStack_8e8;
          auVar59._28_4_ = uStack_8e4;
          auVar12 = vandps_avx(auVar59,local_2c0);
          auVar12 = vmaxps_avx(local_640,auVar12);
          auVar56._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar56._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar56._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar56._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar56._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar56._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar56._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar56._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(auVar59,local_8e0);
          auVar12 = vcmpps_avx(auVar12,auVar56,1);
          auVar271 = ZEXT3264(auVar12);
          auVar255._8_4_ = 0xff800000;
          auVar255._0_8_ = 0xff800000ff800000;
          auVar255._12_4_ = 0xff800000;
          auVar255._16_4_ = 0xff800000;
          auVar255._20_4_ = 0xff800000;
          auVar255._24_4_ = 0xff800000;
          auVar255._28_4_ = 0xff800000;
          auVar251 = vblendvps_avx(auVar255,auVar50,auVar14);
          auVar116 = auVar14 & auVar12;
          if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar116 >> 0x7f,0) != '\0') ||
                (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar116 >> 0xbf,0) != '\0') ||
              (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar116[0x1f] < '\0') {
            auVar173 = vandps_avx(auVar12,auVar14);
            auVar12 = vcmpps_avx(auVar112,ZEXT832(0) << 0x20,2);
            auVar281._8_4_ = 0xff800000;
            auVar281._0_8_ = 0xff800000ff800000;
            auVar281._12_4_ = 0xff800000;
            auVar281._16_4_ = 0xff800000;
            auVar281._20_4_ = 0xff800000;
            auVar281._24_4_ = 0xff800000;
            auVar281._28_4_ = 0xff800000;
            auVar282 = ZEXT3264(auVar281);
            auVar291._8_4_ = 0x7f800000;
            auVar291._0_8_ = 0x7f8000007f800000;
            auVar291._12_4_ = 0x7f800000;
            auVar291._16_4_ = 0x7f800000;
            auVar291._20_4_ = 0x7f800000;
            auVar291._24_4_ = 0x7f800000;
            auVar291._28_4_ = 0x7f800000;
            auVar112 = vblendvps_avx(auVar291,auVar281,auVar12);
            auVar9 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
            auVar116 = vpmovsxwd_avx2(auVar9);
            auVar271 = ZEXT3264(auVar116);
            auVar243 = vblendvps_avx(auVar243,auVar112,auVar116);
            auVar112 = vblendvps_avx(auVar281,auVar291,auVar12);
            auVar277 = ZEXT3264(auVar112);
            auVar251 = vblendvps_avx(auVar251,auVar112,auVar116);
            auVar234._0_8_ = auVar173._0_8_ ^ 0xffffffffffffffff;
            auVar234._8_4_ = auVar173._8_4_ ^ 0xffffffff;
            auVar234._12_4_ = auVar173._12_4_ ^ 0xffffffff;
            auVar234._16_4_ = auVar173._16_4_ ^ 0xffffffff;
            auVar234._20_4_ = auVar173._20_4_ ^ 0xffffffff;
            auVar234._24_4_ = auVar173._24_4_ ^ 0xffffffff;
            auVar234._28_4_ = auVar173._28_4_ ^ 0xffffffff;
            auVar173 = vorps_avx(auVar12,auVar234);
            auVar173 = vandps_avx(auVar14,auVar173);
          }
        }
        auVar260 = ZEXT3264(_local_a40);
        local_4e0 = _local_a40;
        local_4c0 = vminps_avx(local_360,auVar243);
        local_b00 = vmaxps_avx(_local_a40,auVar251);
        auVar244 = ZEXT3264(local_b00);
        local_380 = local_b00;
        auVar112 = vcmpps_avx(_local_a40,local_4c0,2);
        local_740 = vandps_avx(auVar112,auVar111);
        auVar112 = vcmpps_avx(local_b00,local_360,2);
        local_7c0 = vandps_avx(auVar112,auVar111);
        auVar111 = vorps_avx(local_7c0,local_740);
        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar111 >> 0x7f,0) != '\0') ||
              (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar111 >> 0xbf,0) != '\0') ||
            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar111[0x1f] < '\0') {
          local_780._0_8_ = auVar173._0_8_ ^ 0xffffffffffffffff;
          local_780._8_4_ = auVar173._8_4_ ^ 0xffffffff;
          local_780._12_4_ = auVar173._12_4_ ^ 0xffffffff;
          local_780._16_4_ = auVar173._16_4_ ^ 0xffffffff;
          local_780._20_4_ = auVar173._20_4_ ^ 0xffffffff;
          local_780._24_4_ = auVar173._24_4_ ^ 0xffffffff;
          local_780._28_4_ = auVar173._28_4_ ^ 0xffffffff;
          auVar176._0_4_ = (float)local_aa0._0_4_ * auVar175._0_4_;
          auVar176._4_4_ = (float)local_aa0._4_4_ * auVar175._4_4_;
          auVar176._8_4_ = fStack_a98 * auVar175._8_4_;
          auVar176._12_4_ = fStack_a94 * auVar175._12_4_;
          auVar176._16_4_ = fStack_a90 * auVar175._16_4_;
          auVar176._20_4_ = fStack_a8c * auVar175._20_4_;
          auVar176._28_36_ = auVar175._28_36_;
          auVar176._24_4_ = fStack_a88 * auVar175._24_4_;
          auVar9 = vfmadd213ps_fma(auVar144,_local_b20,auVar176._0_32_);
          auVar9 = vfmadd213ps_fma(auVar121,_local_8a0,ZEXT1632(auVar9));
          auVar60._4_4_ = uStack_8fc;
          auVar60._0_4_ = local_900;
          auVar60._8_4_ = uStack_8f8;
          auVar60._12_4_ = uStack_8f4;
          auVar60._16_4_ = uStack_8f0;
          auVar60._20_4_ = uStack_8ec;
          auVar60._24_4_ = uStack_8e8;
          auVar60._28_4_ = uStack_8e4;
          auVar111 = vandps_avx(ZEXT1632(auVar9),auVar60);
          auVar145._8_4_ = 0x3e99999a;
          auVar145._0_8_ = 0x3e99999a3e99999a;
          auVar145._12_4_ = 0x3e99999a;
          auVar145._16_4_ = 0x3e99999a;
          auVar145._20_4_ = 0x3e99999a;
          auVar145._24_4_ = 0x3e99999a;
          auVar145._28_4_ = 0x3e99999a;
          auVar111 = vcmpps_avx(auVar111,auVar145,1);
          auVar111 = vorps_avx(auVar111,local_780);
          auVar146._8_4_ = 3;
          auVar146._0_8_ = 0x300000003;
          auVar146._12_4_ = 3;
          auVar146._16_4_ = 3;
          auVar146._20_4_ = 3;
          auVar146._24_4_ = 3;
          auVar146._28_4_ = 3;
          auVar169._8_4_ = 2;
          auVar169._0_8_ = 0x200000002;
          auVar169._12_4_ = 2;
          auVar169._16_4_ = 2;
          auVar169._20_4_ = 2;
          auVar169._24_4_ = 2;
          auVar169._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar169,auVar146,auVar111);
          local_7a0._4_4_ = local_ccc;
          local_7a0._0_4_ = local_ccc;
          local_7a0._8_4_ = local_ccc;
          local_7a0._12_4_ = local_ccc;
          local_7a0._16_4_ = local_ccc;
          local_7a0._20_4_ = local_ccc;
          local_7a0._24_4_ = local_ccc;
          local_7a0._28_4_ = local_ccc;
          local_760 = vpcmpgtd_avx2(auVar111,local_7a0);
          local_700 = vpandn_avx2(local_760,local_740);
          auVar175 = ZEXT3264(local_700);
          auVar111 = local_740 & ~local_760;
          fStack_bdc = auVar8._4_4_;
          fStack_bd8 = auVar8._8_4_;
          fStack_bd4 = auVar8._12_4_;
          if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar111 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar111 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar111 >> 0x7f,0) == '\0') &&
                (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar111 >> 0xbf,0) == '\0') &&
              (auVar111 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar111[0x1f]) {
            auVar122._4_4_ = fVar263;
            auVar122._0_4_ = fVar263;
            auVar122._8_4_ = fVar263;
            auVar122._12_4_ = fVar263;
            auVar122._16_4_ = fVar263;
            auVar122._20_4_ = fVar263;
            auVar122._24_4_ = fVar263;
            auVar122._28_4_ = fVar263;
            auVar111 = local_7c0;
            fVar201 = (float)local_aa0._0_4_;
            fVar218 = (float)local_aa0._4_4_;
            fVar217 = fStack_a98;
            fVar216 = fStack_a94;
            fVar256 = fStack_a90;
            fVar220 = fStack_a8c;
            fVar219 = fStack_a88;
            local_b00 = auVar18;
            local_7c0 = auVar15;
          }
          else {
            auVar154 = vminps_avx(auVar10,auVar98);
            auVar9 = vmaxps_avx(auVar10,auVar98);
            auVar105 = vminps_avx(auVar7,auVar8);
            auVar100 = vminps_avx(auVar154,auVar105);
            auVar154 = vmaxps_avx(auVar7,auVar8);
            auVar105 = vmaxps_avx(auVar9,auVar154);
            auVar9 = vandps_avx(auVar100,auVar237);
            auVar154 = vandps_avx(auVar105,auVar237);
            auVar9 = vmaxps_avx(auVar9,auVar154);
            auVar154 = vmovshdup_avx(auVar9);
            auVar154 = vmaxss_avx(auVar154,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar154);
            local_a00 = ZEXT1632(CONCAT124(auVar97._4_12_,auVar9._0_4_ * 1.9073486e-06));
            auVar9 = vshufps_avx(auVar105,auVar105,0xff);
            local_8c0._4_4_ = (float)local_a40._4_4_ + (float)local_9c0._4_4_;
            local_8c0._0_4_ = (float)local_a40._0_4_ + (float)local_9c0._0_4_;
            fStack_8b8 = fStack_a38 + fStack_9b8;
            fStack_8b4 = fStack_a34 + fStack_9b4;
            fStack_8b0 = fStack_a30 + fStack_9b0;
            fStack_8ac = fStack_a2c + fStack_9ac;
            fStack_8a8 = fStack_a28 + fStack_9a8;
            fStack_8a4 = fStack_a24 + fStack_9a4;
            do {
              auVar123._8_4_ = 0x7f800000;
              auVar123._0_8_ = 0x7f8000007f800000;
              auVar123._12_4_ = 0x7f800000;
              auVar123._16_4_ = 0x7f800000;
              auVar123._20_4_ = 0x7f800000;
              auVar123._24_4_ = 0x7f800000;
              auVar123._28_4_ = 0x7f800000;
              auVar111 = auVar175._0_32_;
              auVar173 = vblendvps_avx(auVar123,_local_a40,auVar111);
              auVar112 = vshufps_avx(auVar173,auVar173,0xb1);
              auVar112 = vminps_avx(auVar173,auVar112);
              auVar12 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar12);
              auVar12 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar12);
              auVar173 = vcmpps_avx(auVar173,auVar112,0);
              auVar112 = auVar111 & auVar173;
              if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar112 >> 0x7f,0) != '\0') ||
                    (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar112 >> 0xbf,0) != '\0') ||
                  (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar112[0x1f] < '\0') {
                auVar111 = vandps_avx(auVar173,auVar111);
              }
              uVar85 = vmovmskps_avx(auVar111);
              iVar21 = 0;
              for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar86 = iVar21 << 2;
              *(undefined4 *)(local_700 + uVar86) = 0;
              uVar85 = *(uint *)(local_1a0 + uVar86);
              uVar86 = *(uint *)(local_4e0 + uVar86);
              fVar201 = auVar5._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_a60._0_4_);
              }
              local_ac0._0_4_ = fVar201 * 1.9073486e-06;
              auVar97 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar85),0x10);
              auVar260 = ZEXT1664(auVar97);
              bVar92 = true;
              uVar89 = 0;
              do {
                auVar164 = auVar260._0_16_;
                auVar154 = vmovshdup_avx(auVar164);
                fVar215 = auVar154._0_4_;
                fVar216 = 1.0 - fVar215;
                fVar221 = fVar216 * fVar216 * fVar216;
                fVar217 = fVar215 * fVar215;
                fVar218 = fVar215 * fVar217;
                auVar105 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                           ZEXT416((uint)fVar218));
                fVar201 = fVar215 * fVar216;
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar216 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar215 * fVar201)));
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                          ZEXT416((uint)fVar221));
                fVar215 = (auVar97._0_4_ + auVar137._0_4_) * 0.16666667;
                fVar218 = fVar218 * 0.16666667;
                auVar138._0_4_ = fVar218 * fVar129;
                auVar138._4_4_ = fVar218 * fStack_bdc;
                auVar138._8_4_ = fVar218 * fStack_bd8;
                auVar138._12_4_ = fVar218 * fStack_bd4;
                auVar180._4_4_ = fVar215;
                auVar180._0_4_ = fVar215;
                auVar180._8_4_ = fVar215;
                auVar180._12_4_ = fVar215;
                auVar97 = vfmadd132ps_fma(auVar180,auVar138,auVar7);
                fVar215 = (auVar105._0_4_ + auVar100._0_4_) * 0.16666667;
                auVar139._4_4_ = fVar215;
                auVar139._0_4_ = fVar215;
                auVar139._8_4_ = fVar215;
                auVar139._12_4_ = fVar215;
                auVar97 = vfmadd132ps_fma(auVar139,auVar97,auVar98);
                fVar218 = auVar260._0_4_;
                auVar155._4_4_ = fVar218;
                auVar155._0_4_ = fVar218;
                auVar155._8_4_ = fVar218;
                auVar155._12_4_ = fVar218;
                auVar105 = vfmadd213ps_fma(auVar155,local_a50,_DAT_01f7aa10);
                fVar221 = fVar221 * 0.16666667;
                auVar99._4_4_ = fVar221;
                auVar99._0_4_ = fVar221;
                auVar99._8_4_ = fVar221;
                auVar99._12_4_ = fVar221;
                auVar97 = vfmadd132ps_fma(auVar99,auVar97,auVar10);
                local_840._0_16_ = auVar97;
                auVar105 = vsubps_avx(auVar105,auVar97);
                auVar97 = vdpps_avx(auVar105,auVar105,0x7f);
                fVar215 = auVar97._0_4_;
                if (fVar215 < 0.0) {
                  local_a80._0_4_ = fVar217;
                  auVar244._0_4_ = sqrtf(fVar215);
                  auVar244._4_60_ = extraout_var;
                  auVar100 = auVar244._0_16_;
                  fVar217 = (float)local_a80._0_4_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar97,auVar97);
                }
                auVar136 = ZEXT416((uint)fVar216);
                auVar101._4_4_ = fVar216;
                auVar101._0_4_ = fVar216;
                auVar101._8_4_ = fVar216;
                auVar101._12_4_ = fVar216;
                auVar202 = vfnmsub213ss_fma(auVar154,auVar154,ZEXT416((uint)(fVar201 * 4.0)));
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),auVar136,auVar136);
                fVar201 = fVar216 * -fVar216 * 0.5;
                fVar221 = auVar202._0_4_ * 0.5;
                fVar216 = auVar137._0_4_ * 0.5;
                fVar217 = fVar217 * 0.5;
                auVar228._0_4_ = fVar129 * fVar217;
                auVar228._4_4_ = fStack_bdc * fVar217;
                auVar228._8_4_ = fStack_bd8 * fVar217;
                auVar228._12_4_ = fStack_bd4 * fVar217;
                auVar181._4_4_ = fVar216;
                auVar181._0_4_ = fVar216;
                auVar181._8_4_ = fVar216;
                auVar181._12_4_ = fVar216;
                auVar137 = vfmadd213ps_fma(auVar181,auVar7,auVar228);
                auVar203._4_4_ = fVar221;
                auVar203._0_4_ = fVar221;
                auVar203._8_4_ = fVar221;
                auVar203._12_4_ = fVar221;
                auVar137 = vfmadd213ps_fma(auVar203,auVar98,auVar137);
                auVar269._4_4_ = fVar201;
                auVar269._0_4_ = fVar201;
                auVar269._8_4_ = fVar201;
                auVar269._12_4_ = fVar201;
                auVar96 = vfmadd213ps_fma(auVar269,auVar10,auVar137);
                auVar137 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar136,auVar154);
                auVar202 = vfmadd213ss_fma(auVar154,SUB6416(ZEXT464(0xc0000000),0),auVar136);
                auVar154 = vshufps_avx(auVar164,auVar164,0x55);
                auVar182._0_4_ = fVar129 * auVar154._0_4_;
                auVar182._4_4_ = fStack_bdc * auVar154._4_4_;
                auVar182._8_4_ = fStack_bd8 * auVar154._8_4_;
                auVar182._12_4_ = fStack_bd4 * auVar154._12_4_;
                uVar94 = auVar202._0_4_;
                auVar204._4_4_ = uVar94;
                auVar204._0_4_ = uVar94;
                auVar204._8_4_ = uVar94;
                auVar204._12_4_ = uVar94;
                auVar154 = vfmadd213ps_fma(auVar204,auVar7,auVar182);
                auVar156._0_4_ = auVar137._0_4_;
                auVar156._4_4_ = auVar156._0_4_;
                auVar156._8_4_ = auVar156._0_4_;
                auVar156._12_4_ = auVar156._0_4_;
                auVar154 = vfmadd213ps_fma(auVar156,auVar98,auVar154);
                auVar136 = vfmadd231ps_fma(auVar154,auVar10,auVar101);
                auVar137 = vdpps_avx(auVar96,auVar96,0x7f);
                auVar154 = vblendps_avx(auVar137,_DAT_01f7aa10,0xe);
                auVar202 = vrsqrtss_avx(auVar154,auVar154);
                fVar201 = auVar202._0_4_;
                fVar217 = auVar137._0_4_;
                fVar201 = fVar201 * 1.5 + fVar217 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar202 = vdpps_avx(auVar96,auVar136,0x7f);
                auVar157._0_4_ = auVar136._0_4_ * fVar217;
                auVar157._4_4_ = auVar136._4_4_ * fVar217;
                auVar157._8_4_ = auVar136._8_4_ * fVar217;
                auVar157._12_4_ = auVar136._12_4_ * fVar217;
                fVar221 = auVar202._0_4_;
                auVar229._0_4_ = auVar96._0_4_ * fVar221;
                auVar229._4_4_ = auVar96._4_4_ * fVar221;
                fVar216 = auVar96._8_4_;
                auVar229._8_4_ = fVar216 * fVar221;
                fVar256 = auVar96._12_4_;
                auVar229._12_4_ = fVar256 * fVar221;
                auVar202 = vsubps_avx(auVar157,auVar229);
                auVar154 = vrcpss_avx(auVar154,auVar154);
                auVar136 = vfnmadd213ss_fma(auVar154,auVar137,ZEXT416(0x40000000));
                fVar221 = auVar154._0_4_ * auVar136._0_4_;
                auVar154 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                      ZEXT416((uint)(fVar218 * (float)local_ac0._0_4_)));
                auVar282 = ZEXT1664(auVar154);
                auVar247._0_8_ = auVar96._0_8_ ^ 0x8000000080000000;
                auVar247._8_4_ = -fVar216;
                auVar247._12_4_ = -fVar256;
                auVar183._0_4_ = fVar201 * auVar202._0_4_ * fVar221;
                auVar183._4_4_ = fVar201 * auVar202._4_4_ * fVar221;
                auVar183._8_4_ = fVar201 * auVar202._8_4_ * fVar221;
                auVar183._12_4_ = fVar201 * auVar202._12_4_ * fVar221;
                auVar239._0_4_ = auVar96._0_4_ * fVar201;
                auVar239._4_4_ = auVar96._4_4_ * fVar201;
                auVar239._8_4_ = fVar216 * fVar201;
                auVar239._12_4_ = fVar256 * fVar201;
                if (fVar217 < -fVar217) {
                  local_a80._0_4_ = auVar100._0_4_;
                  local_ae0._0_16_ = auVar239;
                  local_9e0._0_16_ = auVar183;
                  fVar201 = sqrtf(fVar217);
                  auVar282 = ZEXT464(auVar154._0_4_);
                  auVar100 = ZEXT416((uint)local_a80._0_4_);
                  auVar183 = local_9e0._0_16_;
                  auVar239 = local_ae0._0_16_;
                }
                else {
                  auVar137 = vsqrtss_avx(auVar137,auVar137);
                  fVar201 = auVar137._0_4_;
                }
                auVar137 = vdpps_avx(auVar105,auVar239,0x7f);
                auVar158 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar100,auVar282._0_16_);
                auVar202 = vdpps_avx(auVar247,auVar239,0x7f);
                auVar136 = vdpps_avx(auVar105,auVar183,0x7f);
                local_a80._0_16_ = vdpps_avx(local_a50,auVar239,0x7f);
                auVar158 = vfmadd213ss_fma(ZEXT416((uint)(auVar100._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a00._0_4_ / fVar201)),
                                           auVar158);
                auVar277 = ZEXT1664(auVar158);
                fVar201 = auVar202._0_4_ + auVar136._0_4_;
                auVar102._0_4_ = auVar137._0_4_ * auVar137._0_4_;
                auVar102._4_4_ = auVar137._4_4_ * auVar137._4_4_;
                auVar102._8_4_ = auVar137._8_4_ * auVar137._8_4_;
                auVar102._12_4_ = auVar137._12_4_ * auVar137._12_4_;
                auVar100 = vdpps_avx(auVar105,auVar247,0x7f);
                auVar136 = vsubps_avx(auVar97,auVar102);
                auVar202 = vrsqrtss_avx(auVar136,auVar136);
                fVar221 = auVar136._0_4_;
                fVar218 = auVar202._0_4_;
                fVar218 = fVar218 * 1.5 + fVar221 * -0.5 * fVar218 * fVar218 * fVar218;
                auVar202 = vdpps_avx(auVar105,local_a50,0x7f);
                auVar100 = vfnmadd231ss_fma(auVar100,auVar137,ZEXT416((uint)fVar201));
                auVar202 = vfnmadd231ss_fma(auVar202,auVar137,local_a80._0_16_);
                if (fVar221 < 0.0) {
                  local_ae0._0_16_ = auVar137;
                  local_9e0._0_4_ = auVar158._0_4_;
                  local_a20._0_16_ = ZEXT416((uint)fVar201);
                  local_860._0_4_ = fVar218;
                  local_880._0_16_ = auVar202;
                  fVar221 = sqrtf(fVar221);
                  auVar277 = ZEXT464((uint)local_9e0._0_4_);
                  auVar282 = ZEXT464(auVar154._0_4_);
                  fVar218 = (float)local_860._0_4_;
                  auVar202 = local_880._0_16_;
                  auVar137 = local_ae0._0_16_;
                  auVar154 = local_a20._0_16_;
                }
                else {
                  auVar154 = vsqrtss_avx(auVar136,auVar136);
                  fVar221 = auVar154._0_4_;
                  auVar154 = ZEXT416((uint)fVar201);
                }
                auVar271 = ZEXT1664(auVar96);
                auVar136 = vpermilps_avx(local_840._0_16_,0xff);
                fVar221 = fVar221 - auVar136._0_4_;
                auVar136 = vshufps_avx(auVar96,auVar96,0xff);
                auVar100 = vfmsub213ss_fma(auVar100,ZEXT416((uint)fVar218),auVar136);
                auVar184._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
                auVar184._8_4_ = local_a80._8_4_ ^ 0x80000000;
                auVar184._12_4_ = local_a80._12_4_ ^ 0x80000000;
                auVar205._0_8_ = auVar100._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar100._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar100._12_4_ ^ 0x80000000;
                auVar158 = ZEXT416((uint)(auVar202._0_4_ * fVar218));
                auVar202 = vfmsub231ss_fma(ZEXT416((uint)(auVar100._0_4_ * local_a80._0_4_)),
                                           auVar154,auVar158);
                auVar100 = vinsertps_avx(auVar205,auVar158,0x1c);
                uVar94 = auVar202._0_4_;
                auVar206._4_4_ = uVar94;
                auVar206._0_4_ = uVar94;
                auVar206._8_4_ = uVar94;
                auVar206._12_4_ = uVar94;
                auVar100 = vdivps_avx(auVar100,auVar206);
                auVar154 = vinsertps_avx(auVar154,auVar184,0x10);
                auVar154 = vdivps_avx(auVar154,auVar206);
                fVar201 = auVar137._0_4_;
                auVar159._0_4_ = fVar201 * auVar100._0_4_ + fVar221 * auVar154._0_4_;
                auVar159._4_4_ = fVar201 * auVar100._4_4_ + fVar221 * auVar154._4_4_;
                auVar159._8_4_ = fVar201 * auVar100._8_4_ + fVar221 * auVar154._8_4_;
                auVar159._12_4_ = fVar201 * auVar100._12_4_ + fVar221 * auVar154._12_4_;
                auVar100 = vsubps_avx(auVar164,auVar159);
                auVar260 = ZEXT1664(auVar100);
                auVar154 = vandps_avx(auVar137,auVar237);
                fVar201 = (float)local_aa0._0_4_;
                fVar218 = (float)local_aa0._4_4_;
                fVar217 = fStack_a98;
                fVar216 = fStack_a94;
                fVar256 = fStack_a90;
                fVar220 = fStack_a8c;
                fVar219 = fStack_a88;
                if (auVar154._0_4_ < auVar277._0_4_) {
                  auVar137 = vfmadd231ss_fma(ZEXT416((uint)(auVar282._0_4_ + auVar277._0_4_)),auVar9
                                             ,ZEXT416(0x36000000));
                  auVar154 = vandps_avx(ZEXT416((uint)fVar221),auVar237);
                  if (auVar154._0_4_ < auVar137._0_4_) {
                    fVar221 = auVar100._0_4_ + (float)local_970._0_4_;
                    if (fVar221 < fVar93) {
                      bVar82 = 0;
                      goto LAB_015be33a;
                    }
                    fVar273 = *(float *)(ray + k * 4 + 0x100);
                    auVar277 = ZEXT464((uint)fVar273);
                    if (fVar221 <= fVar273) {
                      auVar154 = vmovshdup_avx(auVar100);
                      bVar82 = 0;
                      if ((auVar154._0_4_ < 0.0) || (1.0 < auVar154._0_4_)) goto LAB_015be33a;
                      auVar97 = vrsqrtss_avx(auVar97,auVar97);
                      fVar223 = auVar97._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar87].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar82 = 0;
                        goto LAB_015be33a;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar82 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_015be33a;
                      fVar215 = fVar223 * 1.5 + fVar215 * -0.5 * fVar223 * fVar223 * fVar223;
                      local_c20 = auVar105._0_4_;
                      fStack_c1c = auVar105._4_4_;
                      fStack_c18 = auVar105._8_4_;
                      fStack_c14 = auVar105._12_4_;
                      auVar185._0_4_ = fVar215 * local_c20;
                      auVar185._4_4_ = fVar215 * fStack_c1c;
                      auVar185._8_4_ = fVar215 * fStack_c18;
                      auVar185._12_4_ = fVar215 * fStack_c14;
                      auVar164 = vfmadd213ps_fma(auVar136,auVar185,auVar96);
                      auVar97 = vshufps_avx(auVar185,auVar185,0xc9);
                      auVar105 = vshufps_avx(auVar96,auVar96,0xc9);
                      auVar186._0_4_ = auVar185._0_4_ * auVar105._0_4_;
                      auVar186._4_4_ = auVar185._4_4_ * auVar105._4_4_;
                      auVar186._8_4_ = auVar185._8_4_ * auVar105._8_4_;
                      auVar186._12_4_ = auVar185._12_4_ * auVar105._12_4_;
                      auVar137 = vfmsub231ps_fma(auVar186,auVar96,auVar97);
                      auVar97 = vshufps_avx(auVar137,auVar137,0xc9);
                      auVar105 = vshufps_avx(auVar164,auVar164,0xc9);
                      auVar137 = vshufps_avx(auVar137,auVar137,0xd2);
                      auVar103._0_4_ = auVar164._0_4_ * auVar137._0_4_;
                      auVar103._4_4_ = auVar164._4_4_ * auVar137._4_4_;
                      auVar103._8_4_ = auVar164._8_4_ * auVar137._8_4_;
                      auVar103._12_4_ = auVar164._12_4_ * auVar137._12_4_;
                      auVar105 = vfmsub231ps_fma(auVar103,auVar97,auVar105);
                      local_440 = auVar154._0_8_;
                      auVar97 = vmovshdup_avx(auVar105);
                      local_4a0._8_8_ = auVar97._0_8_;
                      auVar97 = vshufps_avx(auVar105,auVar105,0xaa);
                      local_480 = auVar97._0_8_;
                      local_460 = auVar105._0_4_;
                      local_4a0._0_8_ = local_4a0._8_8_;
                      local_4a0._16_8_ = local_4a0._8_8_;
                      local_4a0._24_8_ = local_4a0._8_8_;
                      uStack_478 = local_480;
                      uStack_470 = local_480;
                      uStack_468 = local_480;
                      uStack_45c = local_460;
                      uStack_458 = local_460;
                      uStack_454 = local_460;
                      uStack_450 = local_460;
                      uStack_44c = local_460;
                      uStack_448 = local_460;
                      uStack_444 = local_460;
                      uStack_438 = local_440;
                      uStack_430 = local_440;
                      uStack_428 = local_440;
                      auVar160._12_4_ = 0;
                      auVar160._0_12_ = ZEXT812(0);
                      auVar160 = auVar160 << 0x20;
                      local_420 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_400 = CONCAT44(uStack_67c,local_680);
                      uStack_3f8 = CONCAT44(uStack_674,uStack_678);
                      uStack_3f0 = CONCAT44(uStack_66c,uStack_670);
                      uStack_3e8 = CONCAT44(uStack_664,uStack_668);
                      local_3e0._4_4_ = uStack_65c;
                      local_3e0._0_4_ = local_660;
                      local_3e0._8_4_ = uStack_658;
                      local_3e0._12_4_ = uStack_654;
                      local_3e0._16_4_ = uStack_650;
                      local_3e0._20_4_ = uStack_64c;
                      local_3e0._24_4_ = uStack_648;
                      local_3e0._28_4_ = uStack_644;
                      vpcmpeqd_avx2(local_3e0,local_3e0);
                      local_3c0 = context->user->instID[0];
                      uStack_3bc = local_3c0;
                      uStack_3b8 = local_3c0;
                      uStack_3b4 = local_3c0;
                      uStack_3b0 = local_3c0;
                      uStack_3ac = local_3c0;
                      uStack_3a8 = local_3c0;
                      uStack_3a4 = local_3c0;
                      local_3a0 = context->user->instPrimID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      *(float *)(ray + k * 4 + 0x100) = fVar221;
                      local_9a0 = local_6a0;
                      local_b50.valid = (int *)local_9a0;
                      local_b50.geometryUserPtr = pGVar3->userPtr;
                      local_b50.context = context->user;
                      local_b50.hit = (RTCHitN *)local_4a0;
                      local_b50.N = 8;
                      local_b50.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar260 = ZEXT1664(auVar100);
                        auVar271 = ZEXT1664(auVar96);
                        auVar282 = ZEXT1664(auVar282._0_16_);
                        (*pGVar3->occlusionFilterN)(&local_b50);
                        auVar160 = ZEXT816(0) << 0x40;
                        fVar201 = (float)local_aa0._0_4_;
                        fVar218 = (float)local_aa0._4_4_;
                        fVar217 = fStack_a98;
                        fVar216 = fStack_a94;
                        fVar256 = fStack_a90;
                        fVar220 = fStack_a8c;
                        fVar219 = fStack_a88;
                      }
                      auVar173 = ZEXT1632(auVar160);
                      auVar111 = vpcmpeqd_avx2(local_9a0,auVar173);
                      auVar111 = _DAT_01fe9960 & ~auVar111;
                      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar111 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar111 >> 0x7f,0) != '\0') ||
                            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar111 >> 0xbf,0) != '\0') ||
                          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar111[0x1f] < '\0') {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar260 = ZEXT1664(auVar260._0_16_);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          auVar282 = ZEXT1664(auVar282._0_16_);
                          (*p_Var4)(&local_b50);
                          auVar173 = ZEXT832(0) << 0x40;
                          fVar201 = (float)local_aa0._0_4_;
                          fVar218 = (float)local_aa0._4_4_;
                          fVar217 = fStack_a98;
                          fVar216 = fStack_a94;
                          fVar256 = fStack_a90;
                          fVar220 = fStack_a8c;
                          fVar219 = fStack_a88;
                        }
                        auVar277 = ZEXT464((uint)fVar273);
                        auVar173 = vpcmpeqd_avx2(local_9a0,auVar173);
                        auVar147._8_4_ = 0xff800000;
                        auVar147._0_8_ = 0xff800000ff800000;
                        auVar147._12_4_ = 0xff800000;
                        auVar147._16_4_ = 0xff800000;
                        auVar147._20_4_ = 0xff800000;
                        auVar147._24_4_ = 0xff800000;
                        auVar147._28_4_ = 0xff800000;
                        auVar111 = vblendvps_avx(auVar147,*(undefined1 (*) [32])
                                                           (local_b50.ray + 0x100),auVar173);
                        *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar111;
                        auVar111 = _DAT_01fe9960 & ~auVar173;
                        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar111 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar111 >> 0x7f,0) != '\0')
                              || (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar111 >> 0xbf,0) != '\0') ||
                            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar111[0x1f] < '\0') {
                          bVar82 = 1;
                          goto LAB_015be33a;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar273;
                    }
                    auVar277 = ZEXT464((uint)fVar273);
                    bVar82 = 0;
                    goto LAB_015be33a;
                  }
                }
                bVar92 = uVar89 < 4;
                uVar89 = uVar89 + 1;
              } while (uVar89 != 5);
              bVar92 = false;
              bVar82 = 5;
LAB_015be33a:
              bVar90 = (bool)(bVar90 | bVar92 & bVar82);
              uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar122._4_4_ = uVar94;
              auVar122._0_4_ = uVar94;
              auVar122._8_4_ = uVar94;
              auVar122._12_4_ = uVar94;
              auVar122._16_4_ = uVar94;
              auVar122._20_4_ = uVar94;
              auVar122._24_4_ = uVar94;
              auVar122._28_4_ = uVar94;
              auVar173 = vcmpps_avx(_local_8c0,auVar122,2);
              auVar111 = vandps_avx(auVar173,local_700);
              auVar175 = ZEXT3264(auVar111);
              auVar173 = local_700 & auVar173;
              local_700 = auVar111;
            } while ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar173 >> 0x7f,0) != '\0') ||
                       (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar173 >> 0xbf,0) != '\0') ||
                     (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar173[0x1f] < '\0');
            auVar175 = ZEXT3264(local_380);
            auVar244 = ZEXT3264(local_b00);
            auVar111 = local_7c0;
          }
          auVar12 = local_380;
          auVar152._0_4_ = fVar201 * (float)local_820._0_4_;
          auVar152._4_4_ = fVar218 * (float)local_820._4_4_;
          auVar152._8_4_ = fVar217 * fStack_818;
          auVar152._12_4_ = fVar216 * fStack_814;
          auVar152._16_4_ = fVar256 * fStack_810;
          auVar152._20_4_ = fVar220 * fStack_80c;
          auVar152._28_36_ = auVar175._28_36_;
          auVar152._24_4_ = fVar219 * fStack_808;
          auVar9 = vfmadd213ps_fma(local_940,_local_b20,auVar152._0_32_);
          auVar9 = vfmadd213ps_fma(local_920,_local_8a0,ZEXT1632(auVar9));
          auVar61._4_4_ = uStack_8fc;
          auVar61._0_4_ = local_900;
          auVar61._8_4_ = uStack_8f8;
          auVar61._12_4_ = uStack_8f4;
          auVar61._16_4_ = uStack_8f0;
          auVar61._20_4_ = uStack_8ec;
          auVar61._24_4_ = uStack_8e8;
          auVar61._28_4_ = uStack_8e4;
          auVar173 = vandps_avx(ZEXT1632(auVar9),auVar61);
          auVar170._8_4_ = 0x3e99999a;
          auVar170._0_8_ = 0x3e99999a3e99999a;
          auVar170._12_4_ = 0x3e99999a;
          auVar170._16_4_ = 0x3e99999a;
          auVar170._20_4_ = 0x3e99999a;
          auVar170._24_4_ = 0x3e99999a;
          auVar170._28_4_ = 0x3e99999a;
          auVar173 = vcmpps_avx(auVar173,auVar170,1);
          auVar112 = vorps_avx(auVar173,local_780);
          auVar171._0_4_ = (float)local_9c0._0_4_ + auVar244._0_4_;
          auVar171._4_4_ = (float)local_9c0._4_4_ + auVar244._4_4_;
          auVar171._8_4_ = fStack_9b8 + auVar244._8_4_;
          auVar171._12_4_ = fStack_9b4 + auVar244._12_4_;
          auVar171._16_4_ = fStack_9b0 + auVar244._16_4_;
          auVar171._20_4_ = fStack_9ac + auVar244._20_4_;
          auVar171._24_4_ = fStack_9a8 + auVar244._24_4_;
          auVar171._28_4_ = fStack_9a4 + auVar244._28_4_;
          auVar173 = vcmpps_avx(auVar171,auVar122,2);
          local_920 = vandps_avx(auVar111,auVar173);
          auVar172._8_4_ = 3;
          auVar172._0_8_ = 0x300000003;
          auVar172._12_4_ = 3;
          auVar172._16_4_ = 3;
          auVar172._20_4_ = 3;
          auVar172._24_4_ = 3;
          auVar172._28_4_ = 3;
          auVar199._8_4_ = 2;
          auVar199._0_8_ = 0x200000002;
          auVar199._12_4_ = 2;
          auVar199._16_4_ = 2;
          auVar199._20_4_ = 2;
          auVar199._24_4_ = 2;
          auVar199._28_4_ = 2;
          auVar111 = vblendvps_avx(auVar199,auVar172,auVar112);
          local_940 = vpcmpgtd_avx2(auVar111,local_7a0);
          auVar111 = vpandn_avx2(local_940,local_920);
          auVar173 = local_920 & ~local_940;
          local_720 = auVar111;
          if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar173 >> 0x7f,0) != '\0') ||
                (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar173 >> 0xbf,0) != '\0') ||
              (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar173[0x1f] < '\0') {
            auVar97 = vminps_avx(auVar10,auVar98);
            auVar9 = vmaxps_avx(auVar10,auVar98);
            auVar154 = vminps_avx(auVar7,auVar8);
            auVar105 = vminps_avx(auVar97,auVar154);
            auVar97 = vmaxps_avx(auVar7,auVar8);
            auVar154 = vmaxps_avx(auVar9,auVar97);
            auVar9 = vandps_avx(auVar105,auVar237);
            auVar97 = vandps_avx(auVar154,auVar237);
            auVar9 = vmaxps_avx(auVar9,auVar97);
            auVar97 = vmovshdup_avx(auVar9);
            auVar97 = vmaxss_avx(auVar97,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar97);
            local_a00._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar154,auVar154,0xff);
            local_8c0._4_4_ = (float)local_9c0._4_4_ + local_380._4_4_;
            local_8c0._0_4_ = (float)local_9c0._0_4_ + local_380._0_4_;
            fStack_8b8 = fStack_9b8 + local_380._8_4_;
            fStack_8b4 = fStack_9b4 + local_380._12_4_;
            fStack_8b0 = fStack_9b0 + local_380._16_4_;
            fStack_8ac = fStack_9ac + local_380._20_4_;
            fStack_8a8 = fStack_9a8 + local_380._24_4_;
            fStack_8a4 = fStack_9a4 + local_380._28_4_;
            do {
              auVar124._8_4_ = 0x7f800000;
              auVar124._0_8_ = 0x7f8000007f800000;
              auVar124._12_4_ = 0x7f800000;
              auVar124._16_4_ = 0x7f800000;
              auVar124._20_4_ = 0x7f800000;
              auVar124._24_4_ = 0x7f800000;
              auVar124._28_4_ = 0x7f800000;
              auVar173 = vblendvps_avx(auVar124,auVar12,auVar111);
              auVar112 = vshufps_avx(auVar173,auVar173,0xb1);
              auVar112 = vminps_avx(auVar173,auVar112);
              auVar14 = vshufpd_avx(auVar112,auVar112,5);
              auVar112 = vminps_avx(auVar112,auVar14);
              auVar14 = vpermpd_avx2(auVar112,0x4e);
              auVar112 = vminps_avx(auVar112,auVar14);
              auVar112 = vcmpps_avx(auVar173,auVar112,0);
              auVar14 = auVar111 & auVar112;
              auVar173 = auVar111;
              if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar14 >> 0x7f,0) != '\0') ||
                    (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0xbf,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar14[0x1f] < '\0') {
                auVar173 = vandps_avx(auVar112,auVar111);
              }
              uVar85 = vmovmskps_avx(auVar173);
              iVar21 = 0;
              for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar86 = iVar21 << 2;
              local_720 = auVar111;
              *(undefined4 *)(local_720 + uVar86) = 0;
              uVar85 = *(uint *)(local_1c0 + uVar86);
              uVar86 = *(uint *)(local_360 + uVar86);
              fVar201 = auVar6._0_4_;
              if ((float)local_a60._0_4_ < 0.0) {
                fVar201 = sqrtf((float)local_a60._0_4_);
              }
              local_a80._0_4_ = fVar201 * 1.9073486e-06;
              auVar9 = vinsertps_avx(ZEXT416(uVar86),ZEXT416(uVar85),0x10);
              auVar260 = ZEXT1664(auVar9);
              bVar92 = true;
              uVar89 = 0;
              do {
                auVar137 = auVar260._0_16_;
                auVar97 = vmovshdup_avx(auVar137);
                fVar216 = auVar97._0_4_;
                fVar217 = 1.0 - fVar216;
                fVar221 = fVar217 * fVar217 * fVar217;
                fVar218 = fVar216 * fVar216 * fVar216;
                auVar154 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar221),
                                           ZEXT416((uint)fVar218));
                fVar201 = fVar216 * fVar217;
                auVar105 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * fVar201 * 6.0)),
                                           ZEXT416((uint)(fVar217 * fVar201)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar217 * fVar201 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar216 * fVar201)));
                auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar218),
                                         ZEXT416((uint)fVar221));
                fVar215 = (auVar9._0_4_ + auVar100._0_4_) * 0.16666667;
                fVar218 = fVar218 * 0.16666667;
                auVar140._0_4_ = fVar218 * fVar129;
                auVar140._4_4_ = fVar218 * fStack_bdc;
                auVar140._8_4_ = fVar218 * fStack_bd8;
                auVar140._12_4_ = fVar218 * fStack_bd4;
                auVar187._4_4_ = fVar215;
                auVar187._0_4_ = fVar215;
                auVar187._8_4_ = fVar215;
                auVar187._12_4_ = fVar215;
                auVar9 = vfmadd132ps_fma(auVar187,auVar140,auVar7);
                fVar215 = (auVar154._0_4_ + auVar105._0_4_) * 0.16666667;
                auVar141._4_4_ = fVar215;
                auVar141._0_4_ = fVar215;
                auVar141._8_4_ = fVar215;
                auVar141._12_4_ = fVar215;
                auVar9 = vfmadd132ps_fma(auVar141,auVar9,auVar98);
                fVar218 = auVar260._0_4_;
                auVar161._4_4_ = fVar218;
                auVar161._0_4_ = fVar218;
                auVar161._8_4_ = fVar218;
                auVar161._12_4_ = fVar218;
                auVar154 = vfmadd213ps_fma(auVar161,local_a50,_DAT_01f7aa10);
                fVar221 = fVar221 * 0.16666667;
                auVar104._4_4_ = fVar221;
                auVar104._0_4_ = fVar221;
                auVar104._8_4_ = fVar221;
                auVar104._12_4_ = fVar221;
                auVar9 = vfmadd132ps_fma(auVar104,auVar9,auVar10);
                local_840._0_16_ = auVar9;
                auVar154 = vsubps_avx(auVar154,auVar9);
                auVar9 = vdpps_avx(auVar154,auVar154,0x7f);
                fVar215 = auVar9._0_4_;
                if (fVar215 < 0.0) {
                  local_ac0._0_4_ = fVar201;
                  auVar260._0_4_ = sqrtf(fVar215);
                  auVar260._4_60_ = extraout_var_00;
                  auVar105 = auVar260._0_16_;
                  fVar201 = (float)local_ac0._0_4_;
                }
                else {
                  auVar105 = vsqrtss_avx(auVar9,auVar9);
                }
                auVar96 = ZEXT416((uint)fVar217);
                auVar106._4_4_ = fVar217;
                auVar106._0_4_ = fVar217;
                auVar106._8_4_ = fVar217;
                auVar106._12_4_ = fVar217;
                auVar164 = vfnmsub213ss_fma(auVar97,auVar97,ZEXT416((uint)(fVar201 * 4.0)));
                auVar100 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * 4.0)),auVar96,auVar96);
                fVar201 = fVar217 * -fVar217 * 0.5;
                fVar221 = auVar164._0_4_ * 0.5;
                fVar217 = auVar100._0_4_ * 0.5;
                fVar216 = fVar216 * fVar216 * 0.5;
                auVar230._0_4_ = fVar129 * fVar216;
                auVar230._4_4_ = fStack_bdc * fVar216;
                auVar230._8_4_ = fStack_bd8 * fVar216;
                auVar230._12_4_ = fStack_bd4 * fVar216;
                auVar188._4_4_ = fVar217;
                auVar188._0_4_ = fVar217;
                auVar188._8_4_ = fVar217;
                auVar188._12_4_ = fVar217;
                auVar100 = vfmadd213ps_fma(auVar188,auVar7,auVar230);
                auVar207._4_4_ = fVar221;
                auVar207._0_4_ = fVar221;
                auVar207._8_4_ = fVar221;
                auVar207._12_4_ = fVar221;
                auVar100 = vfmadd213ps_fma(auVar207,auVar98,auVar100);
                auVar270._4_4_ = fVar201;
                auVar270._0_4_ = fVar201;
                auVar270._8_4_ = fVar201;
                auVar270._12_4_ = fVar201;
                auVar202 = vfmadd213ps_fma(auVar270,auVar10,auVar100);
                auVar100 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar96,auVar97);
                auVar164 = vfmadd213ss_fma(auVar97,SUB6416(ZEXT464(0xc0000000),0),auVar96);
                auVar97 = vshufps_avx(auVar137,auVar137,0x55);
                auVar189._0_4_ = fVar129 * auVar97._0_4_;
                auVar189._4_4_ = fStack_bdc * auVar97._4_4_;
                auVar189._8_4_ = fStack_bd8 * auVar97._8_4_;
                auVar189._12_4_ = fStack_bd4 * auVar97._12_4_;
                uVar94 = auVar164._0_4_;
                auVar208._4_4_ = uVar94;
                auVar208._0_4_ = uVar94;
                auVar208._8_4_ = uVar94;
                auVar208._12_4_ = uVar94;
                auVar97 = vfmadd213ps_fma(auVar208,auVar7,auVar189);
                auVar162._0_4_ = auVar100._0_4_;
                auVar162._4_4_ = auVar162._0_4_;
                auVar162._8_4_ = auVar162._0_4_;
                auVar162._12_4_ = auVar162._0_4_;
                auVar97 = vfmadd213ps_fma(auVar162,auVar98,auVar97);
                auVar96 = vfmadd231ps_fma(auVar97,auVar10,auVar106);
                auVar100 = vdpps_avx(auVar202,auVar202,0x7f);
                auVar97 = vblendps_avx(auVar100,_DAT_01f7aa10,0xe);
                auVar164 = vrsqrtss_avx(auVar97,auVar97);
                fVar201 = auVar164._0_4_;
                fVar217 = auVar100._0_4_;
                fVar201 = fVar201 * 1.5 + fVar217 * -0.5 * fVar201 * fVar201 * fVar201;
                auVar164 = vdpps_avx(auVar202,auVar96,0x7f);
                auVar163._0_4_ = auVar96._0_4_ * fVar217;
                auVar163._4_4_ = auVar96._4_4_ * fVar217;
                auVar163._8_4_ = auVar96._8_4_ * fVar217;
                auVar163._12_4_ = auVar96._12_4_ * fVar217;
                fVar221 = auVar164._0_4_;
                auVar231._0_4_ = auVar202._0_4_ * fVar221;
                auVar231._4_4_ = auVar202._4_4_ * fVar221;
                fVar216 = auVar202._8_4_;
                auVar231._8_4_ = fVar216 * fVar221;
                fVar256 = auVar202._12_4_;
                auVar231._12_4_ = fVar256 * fVar221;
                auVar164 = vsubps_avx(auVar163,auVar231);
                auVar97 = vrcpss_avx(auVar97,auVar97);
                auVar96 = vfnmadd213ss_fma(auVar97,auVar100,ZEXT416(0x40000000));
                fVar221 = auVar97._0_4_ * auVar96._0_4_;
                auVar97 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                     ZEXT416((uint)(fVar218 * (float)local_a80._0_4_)));
                auVar175 = ZEXT1664(auVar97);
                auVar240._0_8_ = auVar202._0_8_ ^ 0x8000000080000000;
                auVar240._8_4_ = -fVar216;
                auVar240._12_4_ = -fVar256;
                auVar190._0_4_ = fVar201 * auVar164._0_4_ * fVar221;
                auVar190._4_4_ = fVar201 * auVar164._4_4_ * fVar221;
                auVar190._8_4_ = fVar201 * auVar164._8_4_ * fVar221;
                auVar190._12_4_ = fVar201 * auVar164._12_4_ * fVar221;
                auVar259._0_4_ = auVar202._0_4_ * fVar201;
                auVar259._4_4_ = auVar202._4_4_ * fVar201;
                auVar259._8_4_ = fVar216 * fVar201;
                auVar259._12_4_ = fVar256 * fVar201;
                if (fVar217 < -fVar217) {
                  local_ac0._0_16_ = auVar240;
                  local_b00._0_16_ = auVar259;
                  local_ae0._0_16_ = auVar190;
                  fVar201 = sqrtf(fVar217);
                  auVar175 = ZEXT464(auVar97._0_4_);
                  auVar105 = ZEXT416(auVar105._0_4_);
                  auVar190 = local_ae0._0_16_;
                  auVar240 = local_ac0._0_16_;
                  auVar259 = local_b00._0_16_;
                }
                else {
                  auVar100 = vsqrtss_avx(auVar100,auVar100);
                  fVar201 = auVar100._0_4_;
                }
                auVar100 = vdpps_avx(auVar154,auVar259,0x7f);
                auVar158 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar105,auVar175._0_16_);
                auVar164 = vdpps_avx(auVar240,auVar259,0x7f);
                auVar96 = vdpps_avx(auVar154,auVar190,0x7f);
                auVar136 = vdpps_avx(local_a50,auVar259,0x7f);
                auVar158 = vfmadd213ss_fma(ZEXT416((uint)(auVar105._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a00._0_4_ / fVar201)),
                                           auVar158);
                auVar277 = ZEXT1664(auVar158);
                fVar201 = auVar164._0_4_ + auVar96._0_4_;
                auVar282 = ZEXT464((uint)fVar201);
                fVar221 = auVar100._0_4_;
                auVar107._0_4_ = fVar221 * fVar221;
                auVar107._4_4_ = auVar100._4_4_ * auVar100._4_4_;
                auVar107._8_4_ = auVar100._8_4_ * auVar100._8_4_;
                auVar107._12_4_ = auVar100._12_4_ * auVar100._12_4_;
                auVar105 = vdpps_avx(auVar154,auVar240,0x7f);
                auVar96 = vsubps_avx(auVar9,auVar107);
                auVar164 = vrsqrtss_avx(auVar96,auVar96);
                fVar217 = auVar96._0_4_;
                fVar218 = auVar164._0_4_;
                fVar218 = fVar218 * 1.5 + fVar217 * -0.5 * fVar218 * fVar218 * fVar218;
                auVar164 = vdpps_avx(auVar154,local_a50,0x7f);
                auVar105 = vfnmadd231ss_fma(auVar105,auVar100,ZEXT416((uint)fVar201));
                auVar164 = vfnmadd231ss_fma(auVar164,auVar100,auVar136);
                if (fVar217 < 0.0) {
                  local_ac0._0_4_ = auVar158._0_4_;
                  local_b00._0_16_ = ZEXT416((uint)fVar201);
                  local_ae0._0_16_ = auVar136;
                  local_9e0._0_16_ = auVar105;
                  local_a20._0_4_ = fVar218;
                  local_860._0_16_ = auVar164;
                  fVar201 = sqrtf(fVar217);
                  auVar282 = ZEXT1664(local_b00._0_16_);
                  auVar277 = ZEXT464((uint)local_ac0._0_4_);
                  auVar175 = ZEXT464(auVar97._0_4_);
                  fVar218 = (float)local_a20._0_4_;
                  auVar164 = local_860._0_16_;
                  auVar136 = local_ae0._0_16_;
                  auVar105 = local_9e0._0_16_;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar96,auVar96);
                  fVar201 = auVar97._0_4_;
                }
                auVar271 = ZEXT1664(auVar100);
                auVar244 = ZEXT1664(auVar202);
                auVar97 = vpermilps_avx(local_840._0_16_,0xff);
                fVar201 = fVar201 - auVar97._0_4_;
                auVar96 = vshufps_avx(auVar202,auVar202,0xff);
                auVar97 = vfmsub213ss_fma(auVar105,ZEXT416((uint)fVar218),auVar96);
                auVar191._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
                auVar191._8_4_ = auVar136._8_4_ ^ 0x80000000;
                auVar191._12_4_ = auVar136._12_4_ ^ 0x80000000;
                auVar209._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
                auVar209._8_4_ = auVar97._8_4_ ^ 0x80000000;
                auVar209._12_4_ = auVar97._12_4_ ^ 0x80000000;
                auVar164 = ZEXT416((uint)(auVar164._0_4_ * fVar218));
                auVar158 = auVar282._0_16_;
                auVar105 = vfmsub231ss_fma(ZEXT416((uint)(auVar136._0_4_ * auVar97._0_4_)),auVar158,
                                           auVar164);
                auVar97 = vinsertps_avx(auVar209,auVar164,0x1c);
                uVar94 = auVar105._0_4_;
                auVar210._4_4_ = uVar94;
                auVar210._0_4_ = uVar94;
                auVar210._8_4_ = uVar94;
                auVar210._12_4_ = uVar94;
                auVar97 = vdivps_avx(auVar97,auVar210);
                auVar105 = vinsertps_avx(auVar158,auVar191,0x10);
                auVar105 = vdivps_avx(auVar105,auVar210);
                auVar165._0_4_ = fVar221 * auVar97._0_4_ + fVar201 * auVar105._0_4_;
                auVar165._4_4_ = fVar221 * auVar97._4_4_ + fVar201 * auVar105._4_4_;
                auVar165._8_4_ = fVar221 * auVar97._8_4_ + fVar201 * auVar105._8_4_;
                auVar165._12_4_ = fVar221 * auVar97._12_4_ + fVar201 * auVar105._12_4_;
                auVar105 = vsubps_avx(auVar137,auVar165);
                auVar260 = ZEXT1664(auVar105);
                auVar97 = vandps_avx(auVar100,auVar237);
                if (auVar97._0_4_ < auVar277._0_4_) {
                  auVar137 = vfmadd231ss_fma(ZEXT416((uint)(auVar175._0_4_ + auVar277._0_4_)),
                                             local_880._0_16_,ZEXT416(0x36000000));
                  auVar97 = vandps_avx(ZEXT416((uint)fVar201),auVar237);
                  if (auVar97._0_4_ < auVar137._0_4_) {
                    fVar201 = auVar105._0_4_ + (float)local_970._0_4_;
                    if (fVar201 < fVar93) {
                      bVar82 = 0;
                      goto LAB_015bee39;
                    }
                    fVar218 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar201 <= fVar218) {
                      auVar97 = vmovshdup_avx(auVar105);
                      bVar82 = 0;
                      if ((auVar97._0_4_ < 0.0) || (1.0 < auVar97._0_4_)) goto LAB_015bee39;
                      auVar9 = vrsqrtss_avx(auVar9,auVar9);
                      fVar221 = auVar9._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar87].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar82 = 0;
                        goto LAB_015bee39;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar82 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_015bee39;
                      fVar215 = fVar221 * 1.5 + fVar215 * -0.5 * fVar221 * fVar221 * fVar221;
                      local_c20 = auVar154._0_4_;
                      fStack_c1c = auVar154._4_4_;
                      fStack_c18 = auVar154._8_4_;
                      fStack_c14 = auVar154._12_4_;
                      auVar192._0_4_ = fVar215 * local_c20;
                      auVar192._4_4_ = fVar215 * fStack_c1c;
                      auVar192._8_4_ = fVar215 * fStack_c18;
                      auVar192._12_4_ = fVar215 * fStack_c14;
                      auVar164 = vfmadd213ps_fma(auVar96,auVar192,auVar202);
                      auVar9 = vshufps_avx(auVar192,auVar192,0xc9);
                      auVar154 = vshufps_avx(auVar202,auVar202,0xc9);
                      auVar193._0_4_ = auVar192._0_4_ * auVar154._0_4_;
                      auVar193._4_4_ = auVar192._4_4_ * auVar154._4_4_;
                      auVar193._8_4_ = auVar192._8_4_ * auVar154._8_4_;
                      auVar193._12_4_ = auVar192._12_4_ * auVar154._12_4_;
                      auVar137 = vfmsub231ps_fma(auVar193,auVar202,auVar9);
                      auVar9 = vshufps_avx(auVar137,auVar137,0xc9);
                      auVar154 = vshufps_avx(auVar164,auVar164,0xc9);
                      auVar137 = vshufps_avx(auVar137,auVar137,0xd2);
                      auVar108._0_4_ = auVar164._0_4_ * auVar137._0_4_;
                      auVar108._4_4_ = auVar164._4_4_ * auVar137._4_4_;
                      auVar108._8_4_ = auVar164._8_4_ * auVar137._8_4_;
                      auVar108._12_4_ = auVar164._12_4_ * auVar137._12_4_;
                      auVar154 = vfmsub231ps_fma(auVar108,auVar9,auVar154);
                      local_440 = auVar97._0_8_;
                      auVar9 = vmovshdup_avx(auVar154);
                      local_4a0._8_8_ = auVar9._0_8_;
                      auVar9 = vshufps_avx(auVar154,auVar154,0xaa);
                      local_480 = auVar9._0_8_;
                      local_460 = auVar154._0_4_;
                      local_4a0._0_8_ = local_4a0._8_8_;
                      local_4a0._16_8_ = local_4a0._8_8_;
                      local_4a0._24_8_ = local_4a0._8_8_;
                      uStack_478 = local_480;
                      uStack_470 = local_480;
                      uStack_468 = local_480;
                      uStack_45c = local_460;
                      uStack_458 = local_460;
                      uStack_454 = local_460;
                      uStack_450 = local_460;
                      uStack_44c = local_460;
                      uStack_448 = local_460;
                      uStack_444 = local_460;
                      uStack_438 = local_440;
                      uStack_430 = local_440;
                      uStack_428 = local_440;
                      auVar166._12_4_ = 0;
                      auVar166._0_12_ = ZEXT812(0);
                      auVar166 = auVar166 << 0x20;
                      local_420 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_400 = CONCAT44(uStack_67c,local_680);
                      uStack_3f8 = CONCAT44(uStack_674,uStack_678);
                      uStack_3f0 = CONCAT44(uStack_66c,uStack_670);
                      uStack_3e8 = CONCAT44(uStack_664,uStack_668);
                      local_3e0._4_4_ = uStack_65c;
                      local_3e0._0_4_ = local_660;
                      local_3e0._8_4_ = uStack_658;
                      local_3e0._12_4_ = uStack_654;
                      local_3e0._16_4_ = uStack_650;
                      local_3e0._20_4_ = uStack_64c;
                      local_3e0._24_4_ = uStack_648;
                      local_3e0._28_4_ = uStack_644;
                      vpcmpeqd_avx2(local_3e0,local_3e0);
                      local_3c0 = context->user->instID[0];
                      uStack_3bc = local_3c0;
                      uStack_3b8 = local_3c0;
                      uStack_3b4 = local_3c0;
                      uStack_3b0 = local_3c0;
                      uStack_3ac = local_3c0;
                      uStack_3a8 = local_3c0;
                      uStack_3a4 = local_3c0;
                      local_3a0 = context->user->instPrimID[0];
                      uStack_39c = local_3a0;
                      uStack_398 = local_3a0;
                      uStack_394 = local_3a0;
                      uStack_390 = local_3a0;
                      uStack_38c = local_3a0;
                      uStack_388 = local_3a0;
                      uStack_384 = local_3a0;
                      *(float *)(ray + k * 4 + 0x100) = fVar201;
                      local_9a0 = local_6a0;
                      local_b50.valid = (int *)local_9a0;
                      local_b50.geometryUserPtr = pGVar3->userPtr;
                      local_b50.context = context->user;
                      local_b50.hit = (RTCHitN *)local_4a0;
                      local_b50.N = 8;
                      local_b50.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar244 = ZEXT1664(auVar202);
                        auVar260 = ZEXT1664(auVar105);
                        auVar271 = ZEXT1664(auVar100);
                        auVar277 = ZEXT1664(auVar277._0_16_);
                        auVar282 = ZEXT1664(auVar158);
                        (*pGVar3->occlusionFilterN)(&local_b50);
                        auVar166 = ZEXT816(0) << 0x40;
                      }
                      auVar173 = ZEXT1632(auVar166);
                      auVar111 = vpcmpeqd_avx2(local_9a0,auVar173);
                      auVar111 = _DAT_01fe9960 & ~auVar111;
                      if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar111 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar111 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar111 >> 0x7f,0) != '\0') ||
                            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar111 >> 0xbf,0) != '\0') ||
                          (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar111[0x1f] < '\0') {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar244 = ZEXT1664(auVar244._0_16_);
                          auVar260 = ZEXT1664(auVar260._0_16_);
                          auVar271 = ZEXT1664(auVar271._0_16_);
                          auVar277 = ZEXT1664(auVar277._0_16_);
                          auVar282 = ZEXT1664(auVar282._0_16_);
                          (*p_Var4)(&local_b50);
                          auVar173 = ZEXT832(0) << 0x40;
                        }
                        auVar173 = vpcmpeqd_avx2(local_9a0,auVar173);
                        auVar148._8_4_ = 0xff800000;
                        auVar148._0_8_ = 0xff800000ff800000;
                        auVar148._12_4_ = 0xff800000;
                        auVar148._16_4_ = 0xff800000;
                        auVar148._20_4_ = 0xff800000;
                        auVar148._24_4_ = 0xff800000;
                        auVar148._28_4_ = 0xff800000;
                        auVar111 = vblendvps_avx(auVar148,*(undefined1 (*) [32])
                                                           (local_b50.ray + 0x100),auVar173);
                        *(undefined1 (*) [32])(local_b50.ray + 0x100) = auVar111;
                        auVar111 = _DAT_01fe9960 & ~auVar173;
                        if ((((((((auVar111 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar111 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar111 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar111 >> 0x7f,0) != '\0')
                              || (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar111 >> 0xbf,0) != '\0') ||
                            (auVar111 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar111[0x1f] < '\0') {
                          bVar82 = 1;
                          goto LAB_015bee39;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar218;
                    }
                    bVar82 = 0;
                    goto LAB_015bee39;
                  }
                }
                bVar92 = uVar89 < 4;
                uVar89 = uVar89 + 1;
              } while (uVar89 != 5);
              bVar92 = false;
              bVar82 = 5;
LAB_015bee39:
              bVar90 = (bool)(bVar90 | bVar92 & bVar82);
              uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar122._4_4_ = uVar94;
              auVar122._0_4_ = uVar94;
              auVar122._8_4_ = uVar94;
              auVar122._12_4_ = uVar94;
              auVar122._16_4_ = uVar94;
              auVar122._20_4_ = uVar94;
              auVar122._24_4_ = uVar94;
              auVar122._28_4_ = uVar94;
              auVar173 = vcmpps_avx(_local_8c0,auVar122,2);
              auVar111 = vandps_avx(auVar173,local_720);
              auVar173 = local_720 & auVar173;
              local_720 = auVar111;
            } while ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar173 >> 0x7f,0) != '\0') ||
                       (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar173 >> 0xbf,0) != '\0') ||
                     (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar173[0x1f] < '\0');
          }
          auVar174._0_4_ = (float)local_9c0._0_4_ + local_4e0._0_4_;
          auVar174._4_4_ = (float)local_9c0._4_4_ + local_4e0._4_4_;
          auVar174._8_4_ = fStack_9b8 + local_4e0._8_4_;
          auVar174._12_4_ = fStack_9b4 + local_4e0._12_4_;
          auVar174._16_4_ = fStack_9b0 + local_4e0._16_4_;
          auVar174._20_4_ = fStack_9ac + local_4e0._20_4_;
          auVar174._24_4_ = fStack_9a8 + local_4e0._24_4_;
          auVar174._28_4_ = fStack_9a4 + local_4e0._28_4_;
          auVar173 = vcmpps_avx(auVar174,auVar122,2);
          auVar111 = vandps_avx(local_760,local_740);
          auVar111 = vandps_avx(auVar173,auVar111);
          auVar200._0_4_ = (float)local_9c0._0_4_ + local_380._0_4_;
          auVar200._4_4_ = (float)local_9c0._4_4_ + local_380._4_4_;
          auVar200._8_4_ = fStack_9b8 + local_380._8_4_;
          auVar200._12_4_ = fStack_9b4 + local_380._12_4_;
          auVar200._16_4_ = fStack_9b0 + local_380._16_4_;
          auVar200._20_4_ = fStack_9ac + local_380._20_4_;
          auVar200._24_4_ = fStack_9a8 + local_380._24_4_;
          auVar200._28_4_ = fStack_9a4 + local_380._28_4_;
          auVar112 = vcmpps_avx(auVar200,auVar122,2);
          auVar173 = vandps_avx(local_940,local_920);
          auVar173 = vandps_avx(auVar112,auVar173);
          auVar173 = vorps_avx(auVar111,auVar173);
          if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar173 >> 0x7f,0) != '\0') ||
                (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar173 >> 0xbf,0) != '\0') ||
              (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar173[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar173;
            auVar111 = vblendvps_avx(local_380,local_4e0,auVar111);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar111;
            uVar1 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar91 * 0xc] = uVar1;
            aiStack_138[uVar91 * 0x18] = local_ccc + 1;
            iVar83 = iVar83 + 1;
          }
        }
      }
    }
    if (iVar83 == 0) break;
    uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar125._4_4_ = uVar94;
    auVar125._0_4_ = uVar94;
    auVar125._8_4_ = uVar94;
    auVar125._12_4_ = uVar94;
    auVar125._16_4_ = uVar94;
    auVar125._20_4_ = uVar94;
    auVar125._24_4_ = uVar94;
    auVar125._28_4_ = uVar94;
    uVar85 = -iVar83;
    pauVar84 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar83 - 1) * 0x60);
    fVar201 = (float)local_9c0._0_4_;
    fVar215 = (float)local_9c0._4_4_;
    fVar218 = fStack_9b8;
    fVar221 = fStack_9b4;
    fVar217 = fStack_9b0;
    fVar216 = fStack_9ac;
    fVar256 = fStack_9a8;
    fVar220 = fStack_9a4;
    while( true ) {
      auVar111 = pauVar84[1];
      auVar149._0_4_ = fVar201 + auVar111._0_4_;
      auVar149._4_4_ = fVar215 + auVar111._4_4_;
      auVar149._8_4_ = fVar218 + auVar111._8_4_;
      auVar149._12_4_ = fVar221 + auVar111._12_4_;
      auVar149._16_4_ = fVar217 + auVar111._16_4_;
      auVar149._20_4_ = fVar216 + auVar111._20_4_;
      auVar149._24_4_ = fVar256 + auVar111._24_4_;
      auVar149._28_4_ = fVar220 + auVar111._28_4_;
      auVar173 = vcmpps_avx(auVar149,auVar125,2);
      auVar112 = vandps_avx(auVar173,*pauVar84);
      local_4a0 = auVar112;
      auVar12 = *pauVar84 & auVar173;
      if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0x7f,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0xbf,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar12[0x1f] < '\0') break;
      pauVar84 = pauVar84 + -3;
      uVar85 = uVar85 + 1;
      fVar201 = (float)local_9c0._0_4_;
      fVar215 = (float)local_9c0._4_4_;
      fVar218 = fStack_9b8;
      fVar221 = fStack_9b4;
      fVar217 = fStack_9b0;
      fVar216 = fStack_9ac;
      fVar256 = fStack_9a8;
      fVar220 = fStack_9a4;
      if (uVar85 == 0) goto LAB_015bf443;
    }
    auVar126._8_4_ = 0x7f800000;
    auVar126._0_8_ = 0x7f8000007f800000;
    auVar126._12_4_ = 0x7f800000;
    auVar126._16_4_ = 0x7f800000;
    auVar126._20_4_ = 0x7f800000;
    auVar126._24_4_ = 0x7f800000;
    auVar126._28_4_ = 0x7f800000;
    auVar111 = vblendvps_avx(auVar126,auVar111,auVar112);
    auVar12 = vshufps_avx(auVar111,auVar111,0xb1);
    auVar12 = vminps_avx(auVar111,auVar12);
    auVar14 = vshufpd_avx(auVar12,auVar12,5);
    auVar12 = vminps_avx(auVar12,auVar14);
    auVar14 = vpermpd_avx2(auVar12,0x4e);
    auVar12 = vminps_avx(auVar12,auVar14);
    auVar111 = vcmpps_avx(auVar111,auVar12,0);
    auVar12 = auVar112 & auVar111;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar112 = vandps_avx(auVar111,auVar112);
    }
    uVar89 = *(ulong *)pauVar84[2];
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar89;
    uVar86 = vmovmskps_avx(auVar112);
    iVar83 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      iVar83 = iVar83 + 1;
    }
    *(undefined4 *)(local_4a0 + (uint)(iVar83 << 2)) = 0;
    uVar86 = ~uVar85;
    if ((((((((local_4a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4a0 >> 0x7f,0) != '\0') ||
          (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4a0 >> 0xbf,0) != '\0') ||
        (local_4a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4a0[0x1f] < '\0') {
      uVar86 = -uVar85;
    }
    uVar91 = (ulong)uVar86;
    local_ccc = *(int *)(pauVar84[2] + 8);
    *pauVar84 = local_4a0;
    uVar94 = (undefined4)uVar89;
    auVar150._4_4_ = uVar94;
    auVar150._0_4_ = uVar94;
    auVar150._8_4_ = uVar94;
    auVar150._12_4_ = uVar94;
    auVar150._16_4_ = uVar94;
    auVar150._20_4_ = uVar94;
    auVar150._24_4_ = uVar94;
    auVar150._28_4_ = uVar94;
    auVar9 = vmovshdup_avx(auVar109);
    auVar9 = vsubps_avx(auVar9,auVar109);
    auVar127._0_4_ = auVar9._0_4_;
    auVar127._4_4_ = auVar127._0_4_;
    auVar127._8_4_ = auVar127._0_4_;
    auVar127._12_4_ = auVar127._0_4_;
    auVar127._16_4_ = auVar127._0_4_;
    auVar127._20_4_ = auVar127._0_4_;
    auVar127._24_4_ = auVar127._0_4_;
    auVar127._28_4_ = auVar127._0_4_;
    auVar9 = vfmadd132ps_fma(auVar127,auVar150,_DAT_01faff20);
    local_4e0 = ZEXT1632(auVar9);
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_4e0 + (uint)(iVar83 << 2));
  } while( true );
LAB_015bf443:
  if (bVar90 != false) {
    return bVar90;
  }
  uVar94 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar110._4_4_ = uVar94;
  auVar110._0_4_ = uVar94;
  auVar110._8_4_ = uVar94;
  auVar110._12_4_ = uVar94;
  auVar5 = vcmpps_avx(local_6c0,auVar110,2);
  uVar87 = vmovmskps_avx(auVar5);
  uVar87 = (uint)local_948 & uVar87;
  if (uVar87 == 0) {
    return false;
  }
  goto LAB_015bcc3f;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }